

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx512::CurveNvIntersector1<8>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  int iVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  byte bVar68;
  ulong uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  ulong uVar73;
  Geometry *pGVar74;
  undefined8 unaff_RBX;
  ulong uVar75;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  Primitive *pPVar76;
  long lVar77;
  long lVar78;
  byte bVar79;
  ulong uVar80;
  float fVar81;
  float fVar82;
  float fVar130;
  float fVar131;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar85 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar86 [16];
  float fVar132;
  float fVar134;
  float fVar135;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar87 [16];
  float fVar133;
  float fVar136;
  float fVar137;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar138;
  undefined4 uVar139;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined8 uVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  float fVar156;
  float fVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar168;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [64];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_554;
  ulong local_550;
  RayHit *local_548;
  RayQueryContext *local_540;
  Precalculations *local_538;
  Primitive *local_530;
  Primitive *local_528;
  long local_520;
  RTCFilterFunctionNArguments local_518;
  uint local_4e4;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [8];
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined8 local_490;
  undefined4 local_488;
  float local_484;
  undefined4 local_480;
  uint local_47c;
  undefined4 local_478;
  uint local_474;
  uint local_470;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined1 local_250 [16];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar69 = (ulong)(byte)prim[1];
  pPVar76 = prim + uVar69 * 0x19 + 0x16;
  fVar157 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar152 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  fVar156 = fVar157 * auVar152._0_4_;
  fVar138 = fVar157 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar69 * 4 + 6);
  auVar93 = vpmovsxbd_avx2(auVar83);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar69 * 5 + 6);
  auVar91 = vpmovsxbd_avx2(auVar84);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar69 * 6 + 6);
  auVar103 = vpmovsxbd_avx2(auVar6);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar102 = vpmovsxbd_avx2(auVar7);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar69 * 0xc + 6);
  auVar94 = vpmovsxbd_avx2(auVar8);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar69 * 0xd + 6);
  auVar92 = vpmovsxbd_avx2(auVar9);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar69 * 0x12 + 6);
  auVar95 = vpmovsxbd_avx2(auVar10);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar69 * 0x13 + 6);
  auVar101 = vpmovsxbd_avx2(auVar11);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar69 * 0x14 + 6);
  auVar96 = vpmovsxbd_avx2(auVar12);
  auVar98 = vcvtdq2ps_avx(auVar96);
  auVar200._4_4_ = fVar138;
  auVar200._0_4_ = fVar138;
  auVar200._8_4_ = fVar138;
  auVar200._12_4_ = fVar138;
  auVar200._16_4_ = fVar138;
  auVar200._20_4_ = fVar138;
  auVar200._24_4_ = fVar138;
  auVar200._28_4_ = fVar138;
  auVar202._8_4_ = 1;
  auVar202._0_8_ = 0x100000001;
  auVar202._12_4_ = 1;
  auVar202._16_4_ = 1;
  auVar202._20_4_ = 1;
  auVar202._24_4_ = 1;
  auVar202._28_4_ = 1;
  auVar88 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar206 = ZEXT3264(auVar88);
  auVar90 = ZEXT1632(CONCAT412(fVar157 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar157 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar157 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar138))));
  auVar97 = vpermps_avx2(auVar202,auVar90);
  auVar89 = vpermps_avx512vl(auVar88,auVar90);
  fVar138 = auVar89._0_4_;
  auVar207._0_4_ = fVar138 * auVar103._0_4_;
  fVar148 = auVar89._4_4_;
  auVar207._4_4_ = fVar148 * auVar103._4_4_;
  fVar149 = auVar89._8_4_;
  auVar207._8_4_ = fVar149 * auVar103._8_4_;
  fVar150 = auVar89._12_4_;
  auVar207._12_4_ = fVar150 * auVar103._12_4_;
  fVar168 = auVar89._16_4_;
  auVar207._16_4_ = fVar168 * auVar103._16_4_;
  fVar81 = auVar89._20_4_;
  auVar207._20_4_ = fVar81 * auVar103._20_4_;
  fVar82 = auVar89._24_4_;
  auVar207._28_36_ = in_ZMM4._28_36_;
  auVar207._24_4_ = fVar82 * auVar103._24_4_;
  auVar90._4_4_ = auVar92._4_4_ * fVar148;
  auVar90._0_4_ = auVar92._0_4_ * fVar138;
  auVar90._8_4_ = auVar92._8_4_ * fVar149;
  auVar90._12_4_ = auVar92._12_4_ * fVar150;
  auVar90._16_4_ = auVar92._16_4_ * fVar168;
  auVar90._20_4_ = auVar92._20_4_ * fVar81;
  auVar90._24_4_ = auVar92._24_4_ * fVar82;
  auVar90._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar98._4_4_ * fVar148;
  auVar96._0_4_ = auVar98._0_4_ * fVar138;
  auVar96._8_4_ = auVar98._8_4_ * fVar149;
  auVar96._12_4_ = auVar98._12_4_ * fVar150;
  auVar96._16_4_ = auVar98._16_4_ * fVar168;
  auVar96._20_4_ = auVar98._20_4_ * fVar81;
  auVar96._24_4_ = auVar98._24_4_ * fVar82;
  auVar96._28_4_ = auVar89._28_4_;
  auVar83 = vfmadd231ps_fma(auVar207._0_32_,auVar97,auVar91);
  auVar84 = vfmadd231ps_fma(auVar90,auVar97,auVar94);
  auVar6 = vfmadd231ps_fma(auVar96,auVar101,auVar97);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar200,auVar93);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar200,auVar102);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar95,auVar200);
  auVar201._4_4_ = fVar156;
  auVar201._0_4_ = fVar156;
  auVar201._8_4_ = fVar156;
  auVar201._12_4_ = fVar156;
  auVar201._16_4_ = fVar156;
  auVar201._20_4_ = fVar156;
  auVar201._24_4_ = fVar156;
  auVar201._28_4_ = fVar156;
  auVar97 = ZEXT1632(CONCAT412(fVar157 * auVar152._12_4_,
                               CONCAT48(fVar157 * auVar152._8_4_,
                                        CONCAT44(fVar157 * auVar152._4_4_,fVar156))));
  auVar96 = vpermps_avx2(auVar202,auVar97);
  auVar90 = vpermps_avx512vl(auVar88,auVar97);
  fVar157 = auVar90._0_4_;
  fVar138 = auVar90._4_4_;
  auVar97._4_4_ = fVar138 * auVar103._4_4_;
  auVar97._0_4_ = fVar157 * auVar103._0_4_;
  fVar148 = auVar90._8_4_;
  auVar97._8_4_ = fVar148 * auVar103._8_4_;
  fVar149 = auVar90._12_4_;
  auVar97._12_4_ = fVar149 * auVar103._12_4_;
  fVar150 = auVar90._16_4_;
  auVar97._16_4_ = fVar150 * auVar103._16_4_;
  fVar168 = auVar90._20_4_;
  auVar97._20_4_ = fVar168 * auVar103._20_4_;
  fVar81 = auVar90._24_4_;
  auVar97._24_4_ = fVar81 * auVar103._24_4_;
  auVar97._28_4_ = 1;
  auVar88._4_4_ = auVar92._4_4_ * fVar138;
  auVar88._0_4_ = auVar92._0_4_ * fVar157;
  auVar88._8_4_ = auVar92._8_4_ * fVar148;
  auVar88._12_4_ = auVar92._12_4_ * fVar149;
  auVar88._16_4_ = auVar92._16_4_ * fVar150;
  auVar88._20_4_ = auVar92._20_4_ * fVar168;
  auVar88._24_4_ = auVar92._24_4_ * fVar81;
  auVar88._28_4_ = auVar103._28_4_;
  auVar92._4_4_ = auVar98._4_4_ * fVar138;
  auVar92._0_4_ = auVar98._0_4_ * fVar157;
  auVar92._8_4_ = auVar98._8_4_ * fVar148;
  auVar92._12_4_ = auVar98._12_4_ * fVar149;
  auVar92._16_4_ = auVar98._16_4_ * fVar150;
  auVar92._20_4_ = auVar98._20_4_ * fVar168;
  auVar92._24_4_ = auVar98._24_4_ * fVar81;
  auVar92._28_4_ = auVar90._28_4_;
  auVar7 = vfmadd231ps_fma(auVar97,auVar96,auVar91);
  auVar8 = vfmadd231ps_fma(auVar88,auVar96,auVar94);
  auVar9 = vfmadd231ps_fma(auVar92,auVar96,auVar101);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar201,auVar93);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar201,auVar102);
  auVar189._8_4_ = 0x7fffffff;
  auVar189._0_8_ = 0x7fffffff7fffffff;
  auVar189._12_4_ = 0x7fffffff;
  auVar189._16_4_ = 0x7fffffff;
  auVar189._20_4_ = 0x7fffffff;
  auVar189._24_4_ = 0x7fffffff;
  auVar189._28_4_ = 0x7fffffff;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar201,auVar95);
  auVar93 = vandps_avx(ZEXT1632(auVar83),auVar189);
  auVar187._8_4_ = 0x219392ef;
  auVar187._0_8_ = 0x219392ef219392ef;
  auVar187._12_4_ = 0x219392ef;
  auVar187._16_4_ = 0x219392ef;
  auVar187._20_4_ = 0x219392ef;
  auVar187._24_4_ = 0x219392ef;
  auVar187._28_4_ = 0x219392ef;
  uVar75 = vcmpps_avx512vl(auVar93,auVar187,1);
  bVar16 = (bool)((byte)uVar75 & 1);
  auVar89._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar83._0_4_;
  bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar83._4_4_;
  bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar83._8_4_;
  bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar83._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar84),auVar189);
  uVar75 = vcmpps_avx512vl(auVar93,auVar187,1);
  bVar16 = (bool)((byte)uVar75 & 1);
  auVar99._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar84._0_4_;
  bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar84._4_4_;
  bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar84._8_4_;
  bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar84._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar6),auVar189);
  uVar75 = vcmpps_avx512vl(auVar93,auVar187,1);
  bVar16 = (bool)((byte)uVar75 & 1);
  auVar93._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar6._0_4_;
  bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar6._4_4_;
  bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar6._8_4_;
  bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar6._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar91 = vrcp14ps_avx512vl(auVar89);
  auVar188._8_4_ = 0x3f800000;
  auVar188._0_8_ = 0x3f8000003f800000;
  auVar188._12_4_ = 0x3f800000;
  auVar188._16_4_ = 0x3f800000;
  auVar188._20_4_ = 0x3f800000;
  auVar188._24_4_ = 0x3f800000;
  auVar188._28_4_ = 0x3f800000;
  auVar83 = vfnmadd213ps_fma(auVar89,auVar91,auVar188);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar99);
  auVar84 = vfnmadd213ps_fma(auVar99,auVar91,auVar188);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar93);
  auVar6 = vfnmadd213ps_fma(auVar93,auVar91,auVar188);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar91,auVar91);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 7 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar7));
  auVar95._4_4_ = auVar83._4_4_ * auVar93._4_4_;
  auVar95._0_4_ = auVar83._0_4_ * auVar93._0_4_;
  auVar95._8_4_ = auVar83._8_4_ * auVar93._8_4_;
  auVar95._12_4_ = auVar83._12_4_ * auVar93._12_4_;
  auVar95._16_4_ = auVar93._16_4_ * 0.0;
  auVar95._20_4_ = auVar93._20_4_ * 0.0;
  auVar95._24_4_ = auVar93._24_4_ * 0.0;
  auVar95._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 9 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar7));
  auVar176._0_4_ = auVar83._0_4_ * auVar93._0_4_;
  auVar176._4_4_ = auVar83._4_4_ * auVar93._4_4_;
  auVar176._8_4_ = auVar83._8_4_ * auVar93._8_4_;
  auVar176._12_4_ = auVar83._12_4_ * auVar93._12_4_;
  auVar176._16_4_ = auVar93._16_4_ * 0.0;
  auVar176._20_4_ = auVar93._20_4_ * 0.0;
  auVar176._24_4_ = auVar93._24_4_ * 0.0;
  auVar176._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0xe + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar8));
  auVar101._4_4_ = auVar84._4_4_ * auVar93._4_4_;
  auVar101._0_4_ = auVar84._0_4_ * auVar93._0_4_;
  auVar101._8_4_ = auVar84._8_4_ * auVar93._8_4_;
  auVar101._12_4_ = auVar84._12_4_ * auVar93._12_4_;
  auVar101._16_4_ = auVar93._16_4_ * 0.0;
  auVar101._20_4_ = auVar93._20_4_ * 0.0;
  auVar101._24_4_ = auVar93._24_4_ * 0.0;
  auVar101._28_4_ = auVar93._28_4_;
  auVar92 = vpbroadcastd_avx512vl();
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar8));
  auVar104._0_4_ = auVar84._0_4_ * auVar93._0_4_;
  auVar104._4_4_ = auVar84._4_4_ * auVar93._4_4_;
  auVar104._8_4_ = auVar84._8_4_ * auVar93._8_4_;
  auVar104._12_4_ = auVar84._12_4_ * auVar93._12_4_;
  auVar104._16_4_ = auVar93._16_4_ * 0.0;
  auVar104._20_4_ = auVar93._20_4_ * 0.0;
  auVar104._24_4_ = auVar93._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x15 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar9));
  auVar98._4_4_ = auVar93._4_4_ * auVar6._4_4_;
  auVar98._0_4_ = auVar93._0_4_ * auVar6._0_4_;
  auVar98._8_4_ = auVar93._8_4_ * auVar6._8_4_;
  auVar98._12_4_ = auVar93._12_4_ * auVar6._12_4_;
  auVar98._16_4_ = auVar93._16_4_ * 0.0;
  auVar98._20_4_ = auVar93._20_4_ * 0.0;
  auVar98._24_4_ = auVar93._24_4_ * 0.0;
  auVar98._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x17 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar9));
  auVar100._0_4_ = auVar6._0_4_ * auVar93._0_4_;
  auVar100._4_4_ = auVar6._4_4_ * auVar93._4_4_;
  auVar100._8_4_ = auVar6._8_4_ * auVar93._8_4_;
  auVar100._12_4_ = auVar6._12_4_ * auVar93._12_4_;
  auVar100._16_4_ = auVar93._16_4_ * 0.0;
  auVar100._20_4_ = auVar93._20_4_ * 0.0;
  auVar100._24_4_ = auVar93._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar93 = vpminsd_avx2(auVar95,auVar176);
  auVar91 = vpminsd_avx2(auVar101,auVar104);
  auVar93 = vmaxps_avx(auVar93,auVar91);
  auVar91 = vpminsd_avx2(auVar98,auVar100);
  uVar139 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar103._4_4_ = uVar139;
  auVar103._0_4_ = uVar139;
  auVar103._8_4_ = uVar139;
  auVar103._12_4_ = uVar139;
  auVar103._16_4_ = uVar139;
  auVar103._20_4_ = uVar139;
  auVar103._24_4_ = uVar139;
  auVar103._28_4_ = uVar139;
  auVar91 = vmaxps_avx512vl(auVar91,auVar103);
  auVar93 = vmaxps_avx(auVar93,auVar91);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  auVar91._16_4_ = 0x3f7ffffa;
  auVar91._20_4_ = 0x3f7ffffa;
  auVar91._24_4_ = 0x3f7ffffa;
  auVar91._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar93,auVar91);
  auVar93 = vpmaxsd_avx2(auVar95,auVar176);
  auVar91 = vpmaxsd_avx2(auVar101,auVar104);
  auVar93 = vminps_avx(auVar93,auVar91);
  auVar91 = vpmaxsd_avx2(auVar98,auVar100);
  fVar157 = (ray->super_RayK<1>).tfar;
  auVar102._4_4_ = fVar157;
  auVar102._0_4_ = fVar157;
  auVar102._8_4_ = fVar157;
  auVar102._12_4_ = fVar157;
  auVar102._16_4_ = fVar157;
  auVar102._20_4_ = fVar157;
  auVar102._24_4_ = fVar157;
  auVar102._28_4_ = fVar157;
  auVar91 = vminps_avx512vl(auVar91,auVar102);
  auVar93 = vminps_avx(auVar93,auVar91);
  auVar94._8_4_ = 0x3f800003;
  auVar94._0_8_ = 0x3f8000033f800003;
  auVar94._12_4_ = 0x3f800003;
  auVar94._16_4_ = 0x3f800003;
  auVar94._20_4_ = 0x3f800003;
  auVar94._24_4_ = 0x3f800003;
  auVar94._28_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar94);
  uVar151 = vcmpps_avx512vl(local_80,auVar93,2);
  uVar22 = vpcmpgtd_avx512vl(auVar92,_DAT_01fb4ba0);
  uVar75 = CONCAT44((int)((ulong)unaff_RBX >> 0x20),(uint)(byte)((byte)uVar151 & (byte)uVar22));
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar207 = ZEXT1664(auVar83);
  auVar208 = ZEXT464(0x35000000);
  local_540 = context;
  local_548 = ray;
  local_528 = prim;
  local_530 = pPVar76;
  local_538 = pre;
  do {
    if (uVar75 == 0) {
      return;
    }
    lVar77 = 0;
    for (uVar69 = uVar75; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
      lVar77 = lVar77 + 1;
    }
    uVar75 = uVar75 - 1 & uVar75;
    uVar13 = *(uint *)(prim + lVar77 * 4 + 6);
    uVar69 = (ulong)(uint)((int)lVar77 << 6);
    uVar70 = *(uint *)(prim + 2);
    local_550 = (ulong)uVar70;
    pGVar74 = (context->scene->geometries).items[uVar70].ptr;
    local_4e0 = *(undefined1 (*) [16])(pPVar76 + uVar69);
    if (uVar75 != 0) {
      uVar73 = uVar75 - 1 & uVar75;
      for (uVar80 = uVar75; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      }
      if (uVar73 != 0) {
        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        }
      }
    }
    local_4b0 = *(undefined1 (*) [16])(pPVar76 + uVar69 + 0x10);
    local_4c0 = *(undefined1 (*) [16])(pPVar76 + uVar69 + 0x20);
    _local_4d0 = *(undefined1 (*) [16])(pPVar76 + uVar69 + 0x30);
    iVar14 = (int)pGVar74[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar3 = (ray->super_RayK<1>).org.field_0;
    auVar84 = vsubps_avx(local_4e0,(undefined1  [16])aVar3);
    uVar139 = auVar84._0_4_;
    auVar152._4_4_ = uVar139;
    auVar152._0_4_ = uVar139;
    auVar152._8_4_ = uVar139;
    auVar152._12_4_ = uVar139;
    auVar83 = vshufps_avx(auVar84,auVar84,0x55);
    aVar4 = (pre->ray_space).vx.field_0;
    aVar5 = (pre->ray_space).vy.field_0;
    fVar157 = (pre->ray_space).vz.field_0.m128[0];
    fVar138 = (pre->ray_space).vz.field_0.m128[1];
    fVar148 = (pre->ray_space).vz.field_0.m128[2];
    fVar149 = (pre->ray_space).vz.field_0.m128[3];
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar192._0_4_ = auVar84._0_4_ * fVar157;
    auVar192._4_4_ = auVar84._4_4_ * fVar138;
    auVar192._8_4_ = auVar84._8_4_ * fVar148;
    auVar192._12_4_ = auVar84._12_4_ * fVar149;
    auVar83 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar5,auVar83);
    auVar6 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar152);
    auVar84 = vsubps_avx(local_4b0,(undefined1  [16])aVar3);
    uVar139 = auVar84._0_4_;
    auVar153._4_4_ = uVar139;
    auVar153._0_4_ = uVar139;
    auVar153._8_4_ = uVar139;
    auVar153._12_4_ = uVar139;
    auVar83 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar86._0_4_ = auVar84._0_4_ * fVar157;
    auVar86._4_4_ = auVar84._4_4_ * fVar138;
    auVar86._8_4_ = auVar84._8_4_ * fVar148;
    auVar86._12_4_ = auVar84._12_4_ * fVar149;
    auVar83 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar5,auVar83);
    auVar7 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar153);
    auVar84 = vsubps_avx512vl(local_4c0,(undefined1  [16])aVar3);
    uVar139 = auVar84._0_4_;
    auVar154._4_4_ = uVar139;
    auVar154._0_4_ = uVar139;
    auVar154._8_4_ = uVar139;
    auVar154._12_4_ = uVar139;
    auVar83 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar196._0_4_ = auVar84._0_4_ * fVar157;
    auVar196._4_4_ = auVar84._4_4_ * fVar138;
    auVar196._8_4_ = auVar84._8_4_ * fVar148;
    auVar196._12_4_ = auVar84._12_4_ * fVar149;
    auVar83 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar5,auVar83);
    auVar8 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar154);
    local_3e0 = ZEXT1632((undefined1  [16])aVar3);
    auVar84 = vsubps_avx512vl(_local_4d0,(undefined1  [16])aVar3);
    uVar139 = auVar84._0_4_;
    auVar85._4_4_ = uVar139;
    auVar85._0_4_ = uVar139;
    auVar85._8_4_ = uVar139;
    auVar85._12_4_ = uVar139;
    auVar83 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar197._0_4_ = auVar84._0_4_ * fVar157;
    auVar197._4_4_ = auVar84._4_4_ * fVar138;
    auVar197._8_4_ = auVar84._8_4_ * fVar148;
    auVar197._12_4_ = auVar84._12_4_ * fVar149;
    auVar83 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar5,auVar83);
    auVar9 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar85);
    local_520 = (long)iVar14;
    lVar77 = local_520 * 0x44;
    auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar77);
    uVar139 = auVar6._0_4_;
    local_2e0._4_4_ = uVar139;
    local_2e0._0_4_ = uVar139;
    local_2e0._8_4_ = uVar139;
    local_2e0._12_4_ = uVar139;
    local_2e0._16_4_ = uVar139;
    local_2e0._20_4_ = uVar139;
    local_2e0._24_4_ = uVar139;
    local_2e0._28_4_ = uVar139;
    auVar140._8_4_ = 1;
    auVar140._0_8_ = 0x100000001;
    auVar140._12_4_ = 1;
    auVar140._16_4_ = 1;
    auVar140._20_4_ = 1;
    auVar140._24_4_ = 1;
    auVar140._28_4_ = 1;
    local_300 = vpermps_avx2(auVar140,ZEXT1632(auVar6));
    auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar77 + 0x484);
    uVar139 = auVar7._0_4_;
    auVar87._4_4_ = uVar139;
    auVar87._0_4_ = uVar139;
    auVar87._8_4_ = uVar139;
    auVar87._12_4_ = uVar139;
    local_320._16_4_ = uVar139;
    local_320._0_16_ = auVar87;
    local_320._20_4_ = uVar139;
    local_320._24_4_ = uVar139;
    local_320._28_4_ = uVar139;
    auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar77 + 0x908);
    local_340 = vpermps_avx512vl(auVar140,ZEXT1632(auVar7));
    local_360 = vbroadcastss_avx512vl(auVar8);
    local_380 = vpermps_avx512vl(auVar140,ZEXT1632(auVar8));
    auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar77 + 0xd8c);
    fVar157 = auVar9._0_4_;
    local_3a0._4_4_ = fVar157;
    local_3a0._0_4_ = fVar157;
    fStack_398 = fVar157;
    fStack_394 = fVar157;
    fStack_390 = fVar157;
    fStack_38c = fVar157;
    fStack_388 = fVar157;
    register0x0000139c = fVar157;
    _local_3c0 = vpermps_avx512vl(auVar140,ZEXT1632(auVar9));
    auVar94 = vmulps_avx512vl(_local_3a0,auVar102);
    auVar92 = vmulps_avx512vl(_local_3c0,auVar102);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar103,local_360);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar103,local_380);
    auVar83 = vfmadd231ps_fma(auVar94,auVar91,local_320);
    auVar95 = vfmadd231ps_avx512vl(auVar92,auVar91,local_340);
    auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar93,local_2e0);
    auVar186 = ZEXT3264(auVar96);
    auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar77);
    auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar77 + 0x484);
    auVar97 = vfmadd231ps_avx512vl(auVar95,auVar93,local_300);
    auVar181 = ZEXT3264(auVar97);
    auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar77 + 0x908);
    auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar77 + 0xd8c);
    auVar98 = vmulps_avx512vl(_local_3a0,auVar101);
    auVar90 = vmulps_avx512vl(_local_3c0,auVar101);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_360);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar95,local_380);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar92,local_320);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,local_340);
    auVar10 = vfmadd231ps_fma(auVar98,auVar94,local_2e0);
    auVar190 = ZEXT1664(auVar10);
    auVar11 = vfmadd231ps_fma(auVar90,auVar94,local_300);
    auVar90 = vsubps_avx512vl(ZEXT1632(auVar10),auVar96);
    auVar88 = vsubps_avx512vl(ZEXT1632(auVar11),auVar97);
    auVar98 = vmulps_avx512vl(auVar97,auVar90);
    auVar89 = vmulps_avx512vl(auVar96,auVar88);
    auVar98 = vsubps_avx512vl(auVar98,auVar89);
    auVar83 = vshufps_avx(local_4e0,local_4e0,0xff);
    uVar151 = auVar83._0_8_;
    local_a0._8_8_ = uVar151;
    local_a0._0_8_ = uVar151;
    local_a0._16_8_ = uVar151;
    local_a0._24_8_ = uVar151;
    auVar83 = vshufps_avx(local_4b0,local_4b0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar83);
    auVar83 = vshufps_avx512vl(local_4c0,local_4c0,0xff);
    local_e0 = vbroadcastsd_avx512vl(auVar83);
    auVar83 = vshufps_avx512vl(_local_4d0,_local_4d0,0xff);
    uVar151 = auVar83._0_8_;
    local_100._8_8_ = uVar151;
    local_100._0_8_ = uVar151;
    local_100._16_8_ = uVar151;
    local_100._24_8_ = uVar151;
    auVar89 = vmulps_avx512vl(local_100,auVar102);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar103,local_e0);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar91,local_c0);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar93,local_a0);
    auVar99 = vmulps_avx512vl(local_100,auVar101);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,local_e0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar92,local_c0);
    auVar12 = vfmadd231ps_fma(auVar99,auVar94,local_a0);
    auVar99 = vmulps_avx512vl(auVar88,auVar88);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar90,auVar90);
    auVar100 = vmaxps_avx512vl(auVar89,ZEXT1632(auVar12));
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    auVar99 = vmulps_avx512vl(auVar100,auVar99);
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    uVar151 = vcmpps_avx512vl(auVar98,auVar99,2);
    auVar83 = vblendps_avx(auVar6,local_4e0,8);
    auVar192 = auVar207._0_16_;
    auVar84 = vandps_avx512vl(auVar83,auVar192);
    auVar154 = local_4b0;
    auVar83 = vblendps_avx(auVar7,local_4b0,8);
    auVar83 = vandps_avx512vl(auVar83,auVar192);
    auVar84 = vmaxps_avx(auVar84,auVar83);
    auVar153 = local_4c0;
    auVar83 = vblendps_avx(auVar8,local_4c0,8);
    auVar85 = vandps_avx512vl(auVar83,auVar192);
    auVar152 = _local_4d0;
    auVar83 = vblendps_avx(auVar9,_local_4d0,8);
    auVar83 = vandps_avx512vl(auVar83,auVar192);
    auVar83 = vmaxps_avx(auVar85,auVar83);
    auVar83 = vmaxps_avx(auVar84,auVar83);
    auVar84 = vmovshdup_avx(auVar83);
    auVar84 = vmaxss_avx(auVar84,auVar83);
    auVar83 = vshufpd_avx(auVar83,auVar83,1);
    auVar83 = vmaxss_avx(auVar83,auVar84);
    local_4a0 = vcvtsi2ss_avx512f(_local_4d0,iVar14);
    auVar199._0_4_ = local_4a0._0_4_;
    auVar199._4_4_ = auVar199._0_4_;
    auVar199._8_4_ = auVar199._0_4_;
    auVar199._12_4_ = auVar199._0_4_;
    auVar199._16_4_ = auVar199._0_4_;
    auVar199._20_4_ = auVar199._0_4_;
    auVar199._24_4_ = auVar199._0_4_;
    auVar199._28_4_ = auVar199._0_4_;
    uVar22 = vcmpps_avx512vl(auVar199,_DAT_01f7b060,0xe);
    bVar79 = (byte)uVar151 & (byte)uVar22;
    auVar83 = vmulss_avx512f(auVar83,auVar208._0_16_);
    local_420._0_16_ = auVar83;
    auVar98 = local_420;
    auVar100 = auVar206._0_32_;
    auVar99 = vpermps_avx512vl(auVar100,ZEXT1632(auVar6));
    local_160 = vpermps_avx512vl(auVar100,ZEXT1632(auVar7));
    local_180 = vpermps_avx512vl(auVar100,ZEXT1632(auVar8));
    local_1a0 = vpermps_avx512vl(auVar100,ZEXT1632(auVar9));
    _local_4d0 = auVar152;
    local_4c0 = auVar153;
    local_4b0 = auVar154;
    local_420 = auVar98;
    if (bVar79 != 0) {
      auVar101 = vmulps_avx512vl(local_1a0,auVar101);
      auVar95 = vfmadd213ps_avx512vl(auVar95,local_180,auVar101);
      auVar92 = vfmadd213ps_avx512vl(auVar92,local_160,auVar95);
      auVar92 = vfmadd213ps_avx512vl(auVar94,auVar99,auVar92);
      auVar102 = vmulps_avx512vl(local_1a0,auVar102);
      auVar103 = vfmadd213ps_avx512vl(auVar103,local_180,auVar102);
      auVar95 = vfmadd213ps_avx512vl(auVar91,local_160,auVar103);
      auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar77 + 0x1210);
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar77 + 0x1694);
      auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar77 + 0x1b18);
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar77 + 0x1f9c);
      auVar95 = vfmadd213ps_avx512vl(auVar93,auVar99,auVar95);
      auVar194._0_4_ = fVar157 * auVar94._0_4_;
      auVar194._4_4_ = fVar157 * auVar94._4_4_;
      auVar194._8_4_ = fVar157 * auVar94._8_4_;
      auVar194._12_4_ = fVar157 * auVar94._12_4_;
      auVar194._16_4_ = fVar157 * auVar94._16_4_;
      auVar194._20_4_ = fVar157 * auVar94._20_4_;
      auVar194._24_4_ = fVar157 * auVar94._24_4_;
      auVar194._28_4_ = 0;
      auVar93 = vmulps_avx512vl(_local_3c0,auVar94);
      auVar94 = vmulps_avx512vl(local_1a0,auVar94);
      auVar101 = vfmadd231ps_avx512vl(auVar194,auVar102,local_360);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar102,local_380);
      auVar102 = vfmadd231ps_avx512vl(auVar94,local_180,auVar102);
      auVar94 = vfmadd231ps_avx512vl(auVar101,auVar103,local_320);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar103,local_340);
      auVar101 = vfmadd231ps_avx512vl(auVar102,local_160,auVar103);
      auVar84 = vfmadd231ps_fma(auVar94,auVar91,local_2e0);
      auVar94 = vfmadd231ps_avx512vl(auVar93,auVar91,local_300);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar77 + 0x1210);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar77 + 0x1b18);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar77 + 0x1f9c);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar91);
      auVar34._4_4_ = fVar157 * auVar102._4_4_;
      auVar34._0_4_ = fVar157 * auVar102._0_4_;
      auVar34._8_4_ = fVar157 * auVar102._8_4_;
      auVar34._12_4_ = fVar157 * auVar102._12_4_;
      auVar34._16_4_ = fVar157 * auVar102._16_4_;
      auVar34._20_4_ = fVar157 * auVar102._20_4_;
      auVar34._24_4_ = fVar157 * auVar102._24_4_;
      auVar34._28_4_ = auVar91._28_4_;
      auVar91 = vmulps_avx512vl(_local_3c0,auVar102);
      auVar102 = vmulps_avx512vl(local_1a0,auVar102);
      auVar98 = vfmadd231ps_avx512vl(auVar34,auVar103,local_360);
      auVar104 = vfmadd231ps_avx512vl(auVar91,auVar103,local_380);
      auVar205 = ZEXT3264(auVar99);
      auVar103 = vfmadd231ps_avx512vl(auVar102,local_180,auVar103);
      auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar77 + 0x1694);
      auVar102 = vfmadd231ps_avx512vl(auVar98,auVar91,local_320);
      auVar98 = vfmadd231ps_avx512vl(auVar104,auVar91,local_340);
      auVar91 = vfmadd231ps_avx512vl(auVar103,local_160,auVar91);
      auVar208 = ZEXT1664(auVar208._0_16_);
      auVar206 = ZEXT3264(auVar100);
      auVar207 = ZEXT1664(auVar192);
      auVar6 = vfmadd231ps_fma(auVar102,auVar93,local_2e0);
      auVar103 = vfmadd231ps_avx512vl(auVar98,auVar93,local_300);
      auVar102 = vfmadd231ps_avx512vl(auVar91,auVar99,auVar93);
      auVar203._8_4_ = 0x7fffffff;
      auVar203._0_8_ = 0x7fffffff7fffffff;
      auVar203._12_4_ = 0x7fffffff;
      auVar203._16_4_ = 0x7fffffff;
      auVar203._20_4_ = 0x7fffffff;
      auVar203._24_4_ = 0x7fffffff;
      auVar203._28_4_ = 0x7fffffff;
      auVar93 = vandps_avx(ZEXT1632(auVar84),auVar203);
      auVar91 = vandps_avx(auVar94,auVar203);
      auVar91 = vmaxps_avx(auVar93,auVar91);
      auVar93 = vandps_avx(auVar101,auVar203);
      auVar93 = vmaxps_avx(auVar91,auVar93);
      local_420._0_4_ = auVar83._0_4_;
      auVar198._4_4_ = local_420._0_4_;
      auVar198._0_4_ = local_420._0_4_;
      auVar198._8_4_ = local_420._0_4_;
      auVar198._12_4_ = local_420._0_4_;
      auVar198._16_4_ = local_420._0_4_;
      auVar198._20_4_ = local_420._0_4_;
      auVar198._24_4_ = local_420._0_4_;
      auVar198._28_4_ = local_420._0_4_;
      uVar69 = vcmpps_avx512vl(auVar93,auVar198,1);
      bVar16 = (bool)((byte)uVar69 & 1);
      auVar105._0_4_ = (float)((uint)bVar16 * auVar90._0_4_ | (uint)!bVar16 * auVar84._0_4_);
      bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar16 * auVar90._4_4_ | (uint)!bVar16 * auVar84._4_4_);
      bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar16 * auVar90._8_4_ | (uint)!bVar16 * auVar84._8_4_);
      bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar16 * auVar90._12_4_ | (uint)!bVar16 * auVar84._12_4_);
      fVar157 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar90._16_4_);
      auVar105._16_4_ = fVar157;
      fVar138 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar90._20_4_);
      auVar105._20_4_ = fVar138;
      fVar148 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar90._24_4_);
      auVar105._24_4_ = fVar148;
      uVar72 = (uint)(byte)(uVar69 >> 7) * auVar90._28_4_;
      auVar105._28_4_ = uVar72;
      bVar16 = (bool)((byte)uVar69 & 1);
      auVar106._0_4_ = (float)((uint)bVar16 * auVar88._0_4_ | (uint)!bVar16 * auVar94._0_4_);
      bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar16 * auVar88._4_4_ | (uint)!bVar16 * auVar94._4_4_);
      bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar16 * auVar88._8_4_ | (uint)!bVar16 * auVar94._8_4_);
      bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar16 * auVar88._12_4_ | (uint)!bVar16 * auVar94._12_4_);
      bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar106._16_4_ = (float)((uint)bVar16 * auVar88._16_4_ | (uint)!bVar16 * auVar94._16_4_);
      bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar106._20_4_ = (float)((uint)bVar16 * auVar88._20_4_ | (uint)!bVar16 * auVar94._20_4_);
      bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar106._24_4_ = (float)((uint)bVar16 * auVar88._24_4_ | (uint)!bVar16 * auVar94._24_4_);
      bVar16 = SUB81(uVar69 >> 7,0);
      auVar106._28_4_ = (uint)bVar16 * auVar88._28_4_ | (uint)!bVar16 * auVar94._28_4_;
      auVar93 = vandps_avx(auVar203,ZEXT1632(auVar6));
      auVar91 = vandps_avx(auVar103,auVar203);
      auVar91 = vmaxps_avx(auVar93,auVar91);
      auVar93 = vandps_avx(auVar102,auVar203);
      auVar93 = vmaxps_avx(auVar91,auVar93);
      uVar69 = vcmpps_avx512vl(auVar93,auVar198,1);
      bVar16 = (bool)((byte)uVar69 & 1);
      auVar107._0_4_ = (float)((uint)bVar16 * auVar90._0_4_ | (uint)!bVar16 * auVar6._0_4_);
      bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar16 * auVar90._4_4_ | (uint)!bVar16 * auVar6._4_4_);
      bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar16 * auVar90._8_4_ | (uint)!bVar16 * auVar6._8_4_);
      bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar16 * auVar90._12_4_ | (uint)!bVar16 * auVar6._12_4_);
      fVar150 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar90._16_4_);
      auVar107._16_4_ = fVar150;
      fVar168 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar90._20_4_);
      auVar107._20_4_ = fVar168;
      fVar149 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar90._24_4_);
      auVar107._24_4_ = fVar149;
      auVar107._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar90._28_4_;
      bVar16 = (bool)((byte)uVar69 & 1);
      auVar108._0_4_ = (float)((uint)bVar16 * auVar88._0_4_ | (uint)!bVar16 * auVar103._0_4_);
      bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar16 * auVar88._4_4_ | (uint)!bVar16 * auVar103._4_4_);
      bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar16 * auVar88._8_4_ | (uint)!bVar16 * auVar103._8_4_);
      bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar16 * auVar88._12_4_ | (uint)!bVar16 * auVar103._12_4_);
      bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar108._16_4_ = (float)((uint)bVar16 * auVar88._16_4_ | (uint)!bVar16 * auVar103._16_4_);
      bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar108._20_4_ = (float)((uint)bVar16 * auVar88._20_4_ | (uint)!bVar16 * auVar103._20_4_);
      bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar108._24_4_ = (float)((uint)bVar16 * auVar88._24_4_ | (uint)!bVar16 * auVar103._24_4_);
      bVar16 = SUB81(uVar69 >> 7,0);
      auVar108._28_4_ = (uint)bVar16 * auVar88._28_4_ | (uint)!bVar16 * auVar103._28_4_;
      auVar86 = vxorps_avx512vl(auVar87,auVar87);
      auVar93 = vfmadd213ps_avx512vl(auVar105,auVar105,ZEXT1632(auVar86));
      auVar83 = vfmadd231ps_fma(auVar93,auVar106,auVar106);
      auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
      fVar81 = auVar93._0_4_;
      fVar82 = auVar93._4_4_;
      fVar156 = auVar93._8_4_;
      fVar130 = auVar93._12_4_;
      fVar131 = auVar93._16_4_;
      fVar132 = auVar93._20_4_;
      fVar134 = auVar93._24_4_;
      auVar35._4_4_ = fVar82 * fVar82 * fVar82 * auVar83._4_4_ * -0.5;
      auVar35._0_4_ = fVar81 * fVar81 * fVar81 * auVar83._0_4_ * -0.5;
      auVar35._8_4_ = fVar156 * fVar156 * fVar156 * auVar83._8_4_ * -0.5;
      auVar35._12_4_ = fVar130 * fVar130 * fVar130 * auVar83._12_4_ * -0.5;
      auVar35._16_4_ = fVar131 * fVar131 * fVar131 * -0.0;
      auVar35._20_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar35._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar35._28_4_ = 0;
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar103 = vfmadd231ps_avx512vl(auVar35,auVar91,auVar93);
      auVar36._4_4_ = auVar106._4_4_ * auVar103._4_4_;
      auVar36._0_4_ = auVar106._0_4_ * auVar103._0_4_;
      auVar36._8_4_ = auVar106._8_4_ * auVar103._8_4_;
      auVar36._12_4_ = auVar106._12_4_ * auVar103._12_4_;
      auVar36._16_4_ = auVar106._16_4_ * auVar103._16_4_;
      auVar36._20_4_ = auVar106._20_4_ * auVar103._20_4_;
      auVar36._24_4_ = auVar106._24_4_ * auVar103._24_4_;
      auVar36._28_4_ = auVar93._28_4_;
      auVar37._4_4_ = auVar103._4_4_ * -auVar105._4_4_;
      auVar37._0_4_ = auVar103._0_4_ * -auVar105._0_4_;
      auVar37._8_4_ = auVar103._8_4_ * -auVar105._8_4_;
      auVar37._12_4_ = auVar103._12_4_ * -auVar105._12_4_;
      auVar37._16_4_ = auVar103._16_4_ * -fVar157;
      auVar37._20_4_ = auVar103._20_4_ * -fVar138;
      auVar37._24_4_ = auVar103._24_4_ * -fVar148;
      auVar37._28_4_ = uVar72 ^ 0x80000000;
      auVar93 = vmulps_avx512vl(auVar103,ZEXT1632(auVar86));
      auVar98 = ZEXT1632(auVar86);
      auVar102 = vfmadd213ps_avx512vl(auVar107,auVar107,auVar98);
      auVar83 = vfmadd231ps_fma(auVar102,auVar108,auVar108);
      auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
      fVar157 = auVar102._0_4_;
      fVar138 = auVar102._4_4_;
      fVar148 = auVar102._8_4_;
      fVar81 = auVar102._12_4_;
      fVar82 = auVar102._16_4_;
      fVar156 = auVar102._20_4_;
      fVar130 = auVar102._24_4_;
      auVar38._4_4_ = fVar138 * fVar138 * fVar138 * auVar83._4_4_ * -0.5;
      auVar38._0_4_ = fVar157 * fVar157 * fVar157 * auVar83._0_4_ * -0.5;
      auVar38._8_4_ = fVar148 * fVar148 * fVar148 * auVar83._8_4_ * -0.5;
      auVar38._12_4_ = fVar81 * fVar81 * fVar81 * auVar83._12_4_ * -0.5;
      auVar38._16_4_ = fVar82 * fVar82 * fVar82 * -0.0;
      auVar38._20_4_ = fVar156 * fVar156 * fVar156 * -0.0;
      auVar38._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
      auVar38._28_4_ = 0;
      auVar91 = vfmadd231ps_avx512vl(auVar38,auVar91,auVar102);
      auVar39._4_4_ = auVar108._4_4_ * auVar91._4_4_;
      auVar39._0_4_ = auVar108._0_4_ * auVar91._0_4_;
      auVar39._8_4_ = auVar108._8_4_ * auVar91._8_4_;
      auVar39._12_4_ = auVar108._12_4_ * auVar91._12_4_;
      auVar39._16_4_ = auVar108._16_4_ * auVar91._16_4_;
      auVar39._20_4_ = auVar108._20_4_ * auVar91._20_4_;
      auVar39._24_4_ = auVar108._24_4_ * auVar91._24_4_;
      auVar39._28_4_ = auVar102._28_4_;
      auVar40._4_4_ = -auVar107._4_4_ * auVar91._4_4_;
      auVar40._0_4_ = -auVar107._0_4_ * auVar91._0_4_;
      auVar40._8_4_ = -auVar107._8_4_ * auVar91._8_4_;
      auVar40._12_4_ = -auVar107._12_4_ * auVar91._12_4_;
      auVar40._16_4_ = -fVar150 * auVar91._16_4_;
      auVar40._20_4_ = -fVar168 * auVar91._20_4_;
      auVar40._24_4_ = -fVar149 * auVar91._24_4_;
      auVar40._28_4_ = auVar103._28_4_;
      auVar91 = vmulps_avx512vl(auVar91,auVar98);
      auVar83 = vfmadd213ps_fma(auVar36,auVar89,auVar96);
      auVar84 = vfmadd213ps_fma(auVar37,auVar89,auVar97);
      auVar103 = vfmadd213ps_avx512vl(auVar93,auVar89,auVar95);
      auVar102 = vfmadd213ps_avx512vl(auVar39,ZEXT1632(auVar12),ZEXT1632(auVar10));
      auVar85 = vfnmadd213ps_fma(auVar36,auVar89,auVar96);
      auVar101 = ZEXT1632(auVar12);
      auVar6 = vfmadd213ps_fma(auVar40,auVar101,ZEXT1632(auVar11));
      auVar87 = vfnmadd213ps_fma(auVar37,auVar89,auVar97);
      auVar7 = vfmadd213ps_fma(auVar91,auVar101,auVar92);
      auVar94 = vfnmadd231ps_avx512vl(auVar95,auVar89,auVar93);
      auVar10 = vfnmadd213ps_fma(auVar39,auVar101,ZEXT1632(auVar10));
      auVar11 = vfnmadd213ps_fma(auVar40,auVar101,ZEXT1632(auVar11));
      auVar192 = vfnmadd231ps_fma(auVar92,ZEXT1632(auVar12),auVar91);
      auVar91 = vsubps_avx512vl(auVar102,ZEXT1632(auVar85));
      auVar93 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar87));
      auVar92 = vsubps_avx512vl(ZEXT1632(auVar7),auVar94);
      auVar95 = vmulps_avx512vl(auVar93,auVar94);
      auVar8 = vfmsub231ps_fma(auVar95,ZEXT1632(auVar87),auVar92);
      auVar41._4_4_ = auVar85._4_4_ * auVar92._4_4_;
      auVar41._0_4_ = auVar85._0_4_ * auVar92._0_4_;
      auVar41._8_4_ = auVar85._8_4_ * auVar92._8_4_;
      auVar41._12_4_ = auVar85._12_4_ * auVar92._12_4_;
      auVar41._16_4_ = auVar92._16_4_ * 0.0;
      auVar41._20_4_ = auVar92._20_4_ * 0.0;
      auVar41._24_4_ = auVar92._24_4_ * 0.0;
      auVar41._28_4_ = auVar92._28_4_;
      auVar92 = vfmsub231ps_avx512vl(auVar41,auVar94,auVar91);
      auVar42._4_4_ = auVar87._4_4_ * auVar91._4_4_;
      auVar42._0_4_ = auVar87._0_4_ * auVar91._0_4_;
      auVar42._8_4_ = auVar87._8_4_ * auVar91._8_4_;
      auVar42._12_4_ = auVar87._12_4_ * auVar91._12_4_;
      auVar42._16_4_ = auVar91._16_4_ * 0.0;
      auVar42._20_4_ = auVar91._20_4_ * 0.0;
      auVar42._24_4_ = auVar91._24_4_ * 0.0;
      auVar42._28_4_ = auVar91._28_4_;
      auVar9 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar85),auVar93);
      auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar98,auVar92);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,ZEXT1632(auVar8));
      auVar90 = ZEXT1632(auVar86);
      uVar69 = vcmpps_avx512vl(auVar93,auVar90,2);
      bVar68 = (byte)uVar69;
      fVar81 = (float)((uint)(bVar68 & 1) * auVar83._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar10._0_4_);
      bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
      fVar156 = (float)((uint)bVar16 * auVar83._4_4_ | (uint)!bVar16 * auVar10._4_4_);
      bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
      fVar131 = (float)((uint)bVar16 * auVar83._8_4_ | (uint)!bVar16 * auVar10._8_4_);
      bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
      fVar134 = (float)((uint)bVar16 * auVar83._12_4_ | (uint)!bVar16 * auVar10._12_4_);
      auVar95 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar131,CONCAT44(fVar156,fVar81))));
      fVar82 = (float)((uint)(bVar68 & 1) * auVar84._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar11._0_4_);
      bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
      fVar130 = (float)((uint)bVar16 * auVar84._4_4_ | (uint)!bVar16 * auVar11._4_4_);
      bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
      fVar132 = (float)((uint)bVar16 * auVar84._8_4_ | (uint)!bVar16 * auVar11._8_4_);
      bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
      fVar135 = (float)((uint)bVar16 * auVar84._12_4_ | (uint)!bVar16 * auVar11._12_4_);
      auVar101 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar132,CONCAT44(fVar130,fVar82))));
      auVar109._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar192._0_4_)
      ;
      bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * auVar192._4_4_);
      bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * auVar192._8_4_);
      bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * auVar192._12_4_);
      fVar138 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar103._16_4_);
      auVar109._16_4_ = fVar138;
      fVar157 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar103._20_4_);
      auVar109._20_4_ = fVar157;
      fVar148 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar103._24_4_);
      auVar109._24_4_ = fVar148;
      iVar1 = (uint)(byte)(uVar69 >> 7) * auVar103._28_4_;
      auVar109._28_4_ = iVar1;
      auVar91 = vblendmps_avx512vl(ZEXT1632(auVar85),auVar102);
      auVar110._0_4_ = (uint)(bVar68 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar8._0_4_
      ;
      bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar16 * auVar91._4_4_ | (uint)!bVar16 * auVar8._4_4_;
      bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar16 * auVar91._8_4_ | (uint)!bVar16 * auVar8._8_4_;
      bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar16 * auVar91._12_4_ | (uint)!bVar16 * auVar8._12_4_;
      auVar110._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar91._16_4_;
      auVar110._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar91._20_4_;
      auVar110._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar91._24_4_;
      auVar110._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar91._28_4_;
      auVar91 = vblendmps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar6));
      auVar111._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar84._0_4_);
      bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar16 * auVar91._4_4_ | (uint)!bVar16 * auVar84._4_4_);
      bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar16 * auVar91._8_4_ | (uint)!bVar16 * auVar84._8_4_);
      bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar16 * auVar91._12_4_ | (uint)!bVar16 * auVar84._12_4_);
      fVar150 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar91._16_4_);
      auVar111._16_4_ = fVar150;
      fVar168 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar91._20_4_);
      auVar111._20_4_ = fVar168;
      fVar149 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar91._24_4_);
      auVar111._24_4_ = fVar149;
      auVar111._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar91._28_4_;
      auVar91 = vblendmps_avx512vl(auVar94,ZEXT1632(auVar7));
      auVar112._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar103._0_4_);
      bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar16 * auVar91._4_4_ | (uint)!bVar16 * auVar103._4_4_);
      bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar16 * auVar91._8_4_ | (uint)!bVar16 * auVar103._8_4_);
      bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar16 * auVar91._12_4_ | (uint)!bVar16 * auVar103._12_4_);
      bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar112._16_4_ = (float)((uint)bVar16 * auVar91._16_4_ | (uint)!bVar16 * auVar103._16_4_);
      bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar112._20_4_ = (float)((uint)bVar16 * auVar91._20_4_ | (uint)!bVar16 * auVar103._20_4_);
      bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar112._24_4_ = (float)((uint)bVar16 * auVar91._24_4_ | (uint)!bVar16 * auVar103._24_4_);
      bVar16 = SUB81(uVar69 >> 7,0);
      auVar112._28_4_ = (uint)bVar16 * auVar91._28_4_ | (uint)!bVar16 * auVar103._28_4_;
      auVar113._0_4_ =
           (uint)(bVar68 & 1) * (int)auVar85._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar102._0_4_;
      bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar16 * (int)auVar85._4_4_ | (uint)!bVar16 * auVar102._4_4_;
      bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar16 * (int)auVar85._8_4_ | (uint)!bVar16 * auVar102._8_4_;
      bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar16 * (int)auVar85._12_4_ | (uint)!bVar16 * auVar102._12_4_;
      auVar113._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar102._16_4_;
      auVar113._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar102._20_4_;
      auVar113._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar102._24_4_;
      auVar113._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar102._28_4_;
      bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
      bVar18 = (bool)((byte)(uVar69 >> 2) & 1);
      bVar19 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar114._0_4_ = (uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar7._0_4_
      ;
      bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar17 * auVar94._4_4_ | (uint)!bVar17 * auVar7._4_4_;
      bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar17 * auVar94._8_4_ | (uint)!bVar17 * auVar7._8_4_;
      bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar17 * auVar94._12_4_ | (uint)!bVar17 * auVar7._12_4_;
      auVar114._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar94._16_4_;
      auVar114._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar94._20_4_;
      auVar114._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar94._24_4_;
      iVar2 = (uint)(byte)(uVar69 >> 7) * auVar94._28_4_;
      auVar114._28_4_ = iVar2;
      auVar98 = vsubps_avx512vl(auVar113,auVar95);
      auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar87._12_4_ |
                                              (uint)!bVar19 * auVar6._12_4_,
                                              CONCAT48((uint)bVar18 * (int)auVar87._8_4_ |
                                                       (uint)!bVar18 * auVar6._8_4_,
                                                       CONCAT44((uint)bVar16 * (int)auVar87._4_4_ |
                                                                (uint)!bVar16 * auVar6._4_4_,
                                                                (uint)(bVar68 & 1) *
                                                                (int)auVar87._0_4_ |
                                                                (uint)!(bool)(bVar68 & 1) *
                                                                auVar6._0_4_)))),auVar101);
      auVar186 = ZEXT3264(auVar91);
      auVar103 = vsubps_avx(auVar114,auVar109);
      auVar102 = vsubps_avx(auVar95,auVar110);
      auVar190 = ZEXT3264(auVar102);
      auVar94 = vsubps_avx(auVar101,auVar111);
      auVar92 = vsubps_avx(auVar109,auVar112);
      auVar43._4_4_ = auVar103._4_4_ * fVar156;
      auVar43._0_4_ = auVar103._0_4_ * fVar81;
      auVar43._8_4_ = auVar103._8_4_ * fVar131;
      auVar43._12_4_ = auVar103._12_4_ * fVar134;
      auVar43._16_4_ = auVar103._16_4_ * 0.0;
      auVar43._20_4_ = auVar103._20_4_ * 0.0;
      auVar43._24_4_ = auVar103._24_4_ * 0.0;
      auVar43._28_4_ = iVar2;
      auVar83 = vfmsub231ps_fma(auVar43,auVar109,auVar98);
      auVar44._4_4_ = fVar130 * auVar98._4_4_;
      auVar44._0_4_ = fVar82 * auVar98._0_4_;
      auVar44._8_4_ = fVar132 * auVar98._8_4_;
      auVar44._12_4_ = fVar135 * auVar98._12_4_;
      auVar44._16_4_ = auVar98._16_4_ * 0.0;
      auVar44._20_4_ = auVar98._20_4_ * 0.0;
      auVar44._24_4_ = auVar98._24_4_ * 0.0;
      auVar44._28_4_ = auVar93._28_4_;
      auVar84 = vfmsub231ps_fma(auVar44,auVar95,auVar91);
      auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar90,ZEXT1632(auVar83));
      auVar177._0_4_ = auVar91._0_4_ * auVar109._0_4_;
      auVar177._4_4_ = auVar91._4_4_ * auVar109._4_4_;
      auVar177._8_4_ = auVar91._8_4_ * auVar109._8_4_;
      auVar177._12_4_ = auVar91._12_4_ * auVar109._12_4_;
      auVar177._16_4_ = auVar91._16_4_ * fVar138;
      auVar177._20_4_ = auVar91._20_4_ * fVar157;
      auVar177._24_4_ = auVar91._24_4_ * fVar148;
      auVar177._28_4_ = 0;
      auVar83 = vfmsub231ps_fma(auVar177,auVar101,auVar103);
      auVar96 = vfmadd231ps_avx512vl(auVar93,auVar90,ZEXT1632(auVar83));
      auVar93 = vmulps_avx512vl(auVar92,auVar110);
      auVar93 = vfmsub231ps_avx512vl(auVar93,auVar102,auVar112);
      auVar45._4_4_ = auVar94._4_4_ * auVar112._4_4_;
      auVar45._0_4_ = auVar94._0_4_ * auVar112._0_4_;
      auVar45._8_4_ = auVar94._8_4_ * auVar112._8_4_;
      auVar45._12_4_ = auVar94._12_4_ * auVar112._12_4_;
      auVar45._16_4_ = auVar94._16_4_ * auVar112._16_4_;
      auVar45._20_4_ = auVar94._20_4_ * auVar112._20_4_;
      auVar45._24_4_ = auVar94._24_4_ * auVar112._24_4_;
      auVar45._28_4_ = auVar112._28_4_;
      auVar83 = vfmsub231ps_fma(auVar45,auVar111,auVar92);
      auVar178._0_4_ = auVar111._0_4_ * auVar102._0_4_;
      auVar178._4_4_ = auVar111._4_4_ * auVar102._4_4_;
      auVar178._8_4_ = auVar111._8_4_ * auVar102._8_4_;
      auVar178._12_4_ = auVar111._12_4_ * auVar102._12_4_;
      auVar178._16_4_ = fVar150 * auVar102._16_4_;
      auVar178._20_4_ = fVar168 * auVar102._20_4_;
      auVar178._24_4_ = fVar149 * auVar102._24_4_;
      auVar178._28_4_ = 0;
      auVar84 = vfmsub231ps_fma(auVar178,auVar94,auVar110);
      auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar90,auVar93);
      auVar97 = vfmadd231ps_avx512vl(auVar93,auVar90,ZEXT1632(auVar83));
      auVar181 = ZEXT3264(auVar97);
      auVar93 = vmaxps_avx(auVar96,auVar97);
      uVar151 = vcmpps_avx512vl(auVar93,auVar90,2);
      bVar79 = bVar79 & (byte)uVar151;
      if (bVar79 != 0) {
        auVar46._4_4_ = auVar92._4_4_ * auVar91._4_4_;
        auVar46._0_4_ = auVar92._0_4_ * auVar91._0_4_;
        auVar46._8_4_ = auVar92._8_4_ * auVar91._8_4_;
        auVar46._12_4_ = auVar92._12_4_ * auVar91._12_4_;
        auVar46._16_4_ = auVar92._16_4_ * auVar91._16_4_;
        auVar46._20_4_ = auVar92._20_4_ * auVar91._20_4_;
        auVar46._24_4_ = auVar92._24_4_ * auVar91._24_4_;
        auVar46._28_4_ = auVar93._28_4_;
        auVar7 = vfmsub231ps_fma(auVar46,auVar94,auVar103);
        auVar47._4_4_ = auVar103._4_4_ * auVar102._4_4_;
        auVar47._0_4_ = auVar103._0_4_ * auVar102._0_4_;
        auVar47._8_4_ = auVar103._8_4_ * auVar102._8_4_;
        auVar47._12_4_ = auVar103._12_4_ * auVar102._12_4_;
        auVar47._16_4_ = auVar103._16_4_ * auVar102._16_4_;
        auVar47._20_4_ = auVar103._20_4_ * auVar102._20_4_;
        auVar47._24_4_ = auVar103._24_4_ * auVar102._24_4_;
        auVar47._28_4_ = auVar103._28_4_;
        auVar6 = vfmsub231ps_fma(auVar47,auVar98,auVar92);
        auVar48._4_4_ = auVar94._4_4_ * auVar98._4_4_;
        auVar48._0_4_ = auVar94._0_4_ * auVar98._0_4_;
        auVar48._8_4_ = auVar94._8_4_ * auVar98._8_4_;
        auVar48._12_4_ = auVar94._12_4_ * auVar98._12_4_;
        auVar48._16_4_ = auVar94._16_4_ * auVar98._16_4_;
        auVar48._20_4_ = auVar94._20_4_ * auVar98._20_4_;
        auVar48._24_4_ = auVar94._24_4_ * auVar98._24_4_;
        auVar48._28_4_ = auVar94._28_4_;
        auVar8 = vfmsub231ps_fma(auVar48,auVar102,auVar91);
        auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar8));
        auVar84 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar7),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar93 = vrcp14ps_avx512vl(ZEXT1632(auVar84));
        auVar190 = ZEXT3264(auVar93);
        auVar23._8_4_ = 0x3f800000;
        auVar23._0_8_ = 0x3f8000003f800000;
        auVar23._12_4_ = 0x3f800000;
        auVar23._16_4_ = 0x3f800000;
        auVar23._20_4_ = 0x3f800000;
        auVar23._24_4_ = 0x3f800000;
        auVar23._28_4_ = 0x3f800000;
        auVar91 = vfnmadd213ps_avx512vl(auVar93,ZEXT1632(auVar84),auVar23);
        auVar83 = vfmadd132ps_fma(auVar91,auVar93,auVar93);
        auVar186 = ZEXT1664(auVar83);
        auVar49._4_4_ = auVar8._4_4_ * auVar109._4_4_;
        auVar49._0_4_ = auVar8._0_4_ * auVar109._0_4_;
        auVar49._8_4_ = auVar8._8_4_ * auVar109._8_4_;
        auVar49._12_4_ = auVar8._12_4_ * auVar109._12_4_;
        auVar49._16_4_ = fVar138 * 0.0;
        auVar49._20_4_ = fVar157 * 0.0;
        auVar49._24_4_ = fVar148 * 0.0;
        auVar49._28_4_ = iVar1;
        auVar6 = vfmadd231ps_fma(auVar49,auVar101,ZEXT1632(auVar6));
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar95,ZEXT1632(auVar7));
        fVar138 = auVar83._0_4_;
        fVar148 = auVar83._4_4_;
        fVar149 = auVar83._8_4_;
        fVar150 = auVar83._12_4_;
        local_280 = ZEXT1632(CONCAT412(auVar6._12_4_ * fVar150,
                                       CONCAT48(auVar6._8_4_ * fVar149,
                                                CONCAT44(auVar6._4_4_ * fVar148,
                                                         auVar6._0_4_ * fVar138))));
        auVar193 = ZEXT3264(local_280);
        auVar141._8_4_ = 3;
        auVar141._0_8_ = 0x300000003;
        auVar141._12_4_ = 3;
        auVar141._16_4_ = 3;
        auVar141._20_4_ = 3;
        auVar141._24_4_ = 3;
        auVar141._28_4_ = 3;
        auVar93 = vpermps_avx2(auVar141,ZEXT1632((undefined1  [16])aVar3));
        uVar151 = vcmpps_avx512vl(auVar93,local_280,2);
        fVar157 = (ray->super_RayK<1>).tfar;
        auVar24._4_4_ = fVar157;
        auVar24._0_4_ = fVar157;
        auVar24._8_4_ = fVar157;
        auVar24._12_4_ = fVar157;
        auVar24._16_4_ = fVar157;
        auVar24._20_4_ = fVar157;
        auVar24._24_4_ = fVar157;
        auVar24._28_4_ = fVar157;
        uVar22 = vcmpps_avx512vl(local_280,auVar24,2);
        bVar79 = (byte)uVar151 & (byte)uVar22 & bVar79;
        if (bVar79 != 0) {
          uVar80 = vcmpps_avx512vl(ZEXT1632(auVar84),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar80 = bVar79 & uVar80;
          if ((char)uVar80 != '\0') {
            fVar157 = auVar96._0_4_ * fVar138;
            fVar168 = auVar96._4_4_ * fVar148;
            auVar50._4_4_ = fVar168;
            auVar50._0_4_ = fVar157;
            fVar81 = auVar96._8_4_ * fVar149;
            auVar50._8_4_ = fVar81;
            fVar82 = auVar96._12_4_ * fVar150;
            auVar50._12_4_ = fVar82;
            fVar156 = auVar96._16_4_ * 0.0;
            auVar50._16_4_ = fVar156;
            fVar130 = auVar96._20_4_ * 0.0;
            auVar50._20_4_ = fVar130;
            fVar131 = auVar96._24_4_ * 0.0;
            auVar50._24_4_ = fVar131;
            auVar50._28_4_ = auVar96._28_4_;
            auVar142._8_4_ = 0x3f800000;
            auVar142._0_8_ = 0x3f8000003f800000;
            auVar142._12_4_ = 0x3f800000;
            auVar142._16_4_ = 0x3f800000;
            auVar142._20_4_ = 0x3f800000;
            auVar142._24_4_ = 0x3f800000;
            auVar142._28_4_ = 0x3f800000;
            auVar93 = vsubps_avx(auVar142,auVar50);
            local_2c0._0_4_ =
                 (float)((uint)(bVar68 & 1) * (int)fVar157 |
                        (uint)!(bool)(bVar68 & 1) * auVar93._0_4_);
            bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
            local_2c0._4_4_ = (float)((uint)bVar16 * (int)fVar168 | (uint)!bVar16 * auVar93._4_4_);
            bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
            local_2c0._8_4_ = (float)((uint)bVar16 * (int)fVar81 | (uint)!bVar16 * auVar93._8_4_);
            bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
            local_2c0._12_4_ = (float)((uint)bVar16 * (int)fVar82 | (uint)!bVar16 * auVar93._12_4_);
            bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
            local_2c0._16_4_ = (float)((uint)bVar16 * (int)fVar156 | (uint)!bVar16 * auVar93._16_4_)
            ;
            bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
            local_2c0._20_4_ = (float)((uint)bVar16 * (int)fVar130 | (uint)!bVar16 * auVar93._20_4_)
            ;
            bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
            local_2c0._24_4_ = (float)((uint)bVar16 * (int)fVar131 | (uint)!bVar16 * auVar93._24_4_)
            ;
            bVar16 = SUB81(uVar69 >> 7,0);
            local_2c0._28_4_ =
                 (float)((uint)bVar16 * auVar96._28_4_ | (uint)!bVar16 * auVar93._28_4_);
            auVar93 = vsubps_avx(ZEXT1632(auVar12),auVar89);
            auVar83 = vfmadd213ps_fma(auVar93,local_2c0,auVar89);
            fVar157 = pre->depth_scale;
            auVar25._4_4_ = fVar157;
            auVar25._0_4_ = fVar157;
            auVar25._8_4_ = fVar157;
            auVar25._12_4_ = fVar157;
            auVar25._16_4_ = fVar157;
            auVar25._20_4_ = fVar157;
            auVar25._24_4_ = fVar157;
            auVar25._28_4_ = fVar157;
            auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                         CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                                  CONCAT44(auVar83._4_4_ +
                                                                           auVar83._4_4_,
                                                                           auVar83._0_4_ +
                                                                           auVar83._0_4_)))),auVar25
                                     );
            uVar73 = vcmpps_avx512vl(local_280,auVar93,6);
            uVar80 = uVar80 & uVar73;
            bVar79 = (byte)uVar80;
            if (bVar79 != 0) {
              auVar166._0_4_ = auVar97._0_4_ * fVar138;
              auVar166._4_4_ = auVar97._4_4_ * fVar148;
              auVar166._8_4_ = auVar97._8_4_ * fVar149;
              auVar166._12_4_ = auVar97._12_4_ * fVar150;
              auVar166._16_4_ = auVar97._16_4_ * 0.0;
              auVar166._20_4_ = auVar97._20_4_ * 0.0;
              auVar166._24_4_ = auVar97._24_4_ * 0.0;
              auVar166._28_4_ = 0;
              auVar173._8_4_ = 0x3f800000;
              auVar173._0_8_ = 0x3f8000003f800000;
              auVar173._12_4_ = 0x3f800000;
              auVar173._16_4_ = 0x3f800000;
              auVar173._20_4_ = 0x3f800000;
              auVar173._24_4_ = 0x3f800000;
              auVar173._28_4_ = 0x3f800000;
              auVar93 = vsubps_avx(auVar173,auVar166);
              auVar115._0_4_ =
                   (uint)(bVar68 & 1) * (int)auVar166._0_4_ |
                   (uint)!(bool)(bVar68 & 1) * auVar93._0_4_;
              bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
              auVar115._4_4_ = (uint)bVar16 * (int)auVar166._4_4_ | (uint)!bVar16 * auVar93._4_4_;
              bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
              auVar115._8_4_ = (uint)bVar16 * (int)auVar166._8_4_ | (uint)!bVar16 * auVar93._8_4_;
              bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
              auVar115._12_4_ = (uint)bVar16 * (int)auVar166._12_4_ | (uint)!bVar16 * auVar93._12_4_
              ;
              bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
              auVar115._16_4_ = (uint)bVar16 * (int)auVar166._16_4_ | (uint)!bVar16 * auVar93._16_4_
              ;
              bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
              auVar115._20_4_ = (uint)bVar16 * (int)auVar166._20_4_ | (uint)!bVar16 * auVar93._20_4_
              ;
              bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
              auVar115._24_4_ = (uint)bVar16 * (int)auVar166._24_4_ | (uint)!bVar16 * auVar93._24_4_
              ;
              auVar115._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar93._28_4_;
              auVar26._8_4_ = 0x40000000;
              auVar26._0_8_ = 0x4000000040000000;
              auVar26._12_4_ = 0x40000000;
              auVar26._16_4_ = 0x40000000;
              auVar26._20_4_ = 0x40000000;
              auVar26._24_4_ = 0x40000000;
              auVar26._28_4_ = 0x40000000;
              local_2a0 = vfmsub132ps_avx512vl(auVar115,auVar173,auVar26);
              local_260 = 0;
              local_25c = iVar14;
              auVar190 = ZEXT1664(local_4e0);
              local_250 = local_4e0;
              local_240 = local_4b0._0_8_;
              uStack_238 = local_4b0._8_8_;
              local_230 = local_4c0._0_8_;
              uStack_228 = local_4c0._8_8_;
              local_220 = local_4d0;
              uStack_218 = uStack_4c8;
              if ((pGVar74->mask & (ray->super_RayK<1>).mask) != 0) {
                fVar157 = 1.0 / auVar199._0_4_;
                local_200[0] = fVar157 * (local_2c0._0_4_ + 0.0);
                local_200[1] = fVar157 * (local_2c0._4_4_ + 1.0);
                local_200[2] = fVar157 * (local_2c0._8_4_ + 2.0);
                local_200[3] = fVar157 * (local_2c0._12_4_ + 3.0);
                fStack_1f0 = fVar157 * (local_2c0._16_4_ + 4.0);
                fStack_1ec = fVar157 * (local_2c0._20_4_ + 5.0);
                fStack_1e8 = fVar157 * (local_2c0._24_4_ + 6.0);
                fStack_1e4 = local_2c0._28_4_ + 7.0;
                local_1e0 = local_2a0;
                local_1c0 = local_280;
                auVar143._8_4_ = 0x7f800000;
                auVar143._0_8_ = 0x7f8000007f800000;
                auVar143._12_4_ = 0x7f800000;
                auVar143._16_4_ = 0x7f800000;
                auVar143._20_4_ = 0x7f800000;
                auVar143._24_4_ = 0x7f800000;
                auVar143._28_4_ = 0x7f800000;
                auVar93 = vblendmps_avx512vl(auVar143,local_280);
                auVar116._0_4_ =
                     (uint)(bVar79 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar116._4_4_ = (uint)bVar16 * auVar93._4_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar116._8_4_ = (uint)bVar16 * auVar93._8_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
                auVar116._12_4_ = (uint)bVar16 * auVar93._12_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
                auVar116._16_4_ = (uint)bVar16 * auVar93._16_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                auVar116._20_4_ = (uint)bVar16 * auVar93._20_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
                auVar116._24_4_ = (uint)bVar16 * auVar93._24_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = SUB81(uVar80 >> 7,0);
                auVar116._28_4_ = (uint)bVar16 * auVar93._28_4_ | (uint)!bVar16 * 0x7f800000;
                auVar93 = vshufps_avx(auVar116,auVar116,0xb1);
                auVar93 = vminps_avx(auVar116,auVar93);
                auVar91 = vshufpd_avx(auVar93,auVar93,5);
                auVar93 = vminps_avx(auVar93,auVar91);
                auVar91 = vpermpd_avx2(auVar93,0x4e);
                auVar93 = vminps_avx(auVar93,auVar91);
                uVar151 = vcmpps_avx512vl(auVar116,auVar93,0);
                uVar72 = (uint)uVar80;
                if ((bVar79 & (byte)uVar151) != 0) {
                  uVar72 = (uint)(bVar79 & (byte)uVar151);
                }
                uVar71 = 0;
                for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
                  uVar71 = uVar71 + 1;
                }
                uVar69 = (ulong)uVar71;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar74->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_400 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  local_440 = local_280;
                  local_460 = auVar99;
                  do {
                    local_484 = local_200[uVar69];
                    local_480 = *(undefined4 *)(local_1e0 + uVar69 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar69 * 4);
                    local_518.context = context->user;
                    fVar138 = 1.0 - local_484;
                    fVar157 = fVar138 * fVar138 * -3.0;
                    auVar181 = ZEXT464((uint)fVar157);
                    auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138)),
                                              ZEXT416((uint)(local_484 * fVar138)),
                                              ZEXT416(0xc0000000));
                    auVar84 = vfmsub132ss_fma(ZEXT416((uint)(local_484 * fVar138)),
                                              ZEXT416((uint)(local_484 * local_484)),
                                              ZEXT416(0x40000000));
                    fVar138 = auVar83._0_4_ * 3.0;
                    fVar148 = auVar84._0_4_ * 3.0;
                    fVar149 = local_484 * local_484 * 3.0;
                    auVar185._0_4_ = fVar149 * (float)local_4d0._0_4_;
                    auVar185._4_4_ = fVar149 * (float)local_4d0._4_4_;
                    auVar185._8_4_ = fVar149 * (float)uStack_4c8;
                    auVar185._12_4_ = fVar149 * uStack_4c8._4_4_;
                    auVar186 = ZEXT1664(auVar185);
                    auVar164._4_4_ = fVar148;
                    auVar164._0_4_ = fVar148;
                    auVar164._8_4_ = fVar148;
                    auVar164._12_4_ = fVar148;
                    auVar83 = vfmadd132ps_fma(auVar164,auVar185,local_4c0);
                    auVar172._4_4_ = fVar138;
                    auVar172._0_4_ = fVar138;
                    auVar172._8_4_ = fVar138;
                    auVar172._12_4_ = fVar138;
                    auVar83 = vfmadd132ps_fma(auVar172,auVar83,local_4b0);
                    auVar165._4_4_ = fVar157;
                    auVar165._0_4_ = fVar157;
                    auVar165._8_4_ = fVar157;
                    auVar165._12_4_ = fVar157;
                    auVar83 = vfmadd213ps_fma(auVar165,auVar190._0_16_,auVar83);
                    local_490 = vmovlps_avx(auVar83);
                    local_488 = vextractps_avx(auVar83,2);
                    local_47c = uVar13;
                    local_478 = (int)local_550;
                    local_474 = (local_518.context)->instID[0];
                    local_470 = (local_518.context)->instPrimID[0];
                    local_554 = -1;
                    local_518.valid = &local_554;
                    local_518.geometryUserPtr = pGVar74->userPtr;
                    local_518.ray = (RTCRayN *)ray;
                    local_518.hit = (RTCHitN *)&local_490;
                    local_518.N = 1;
                    if (pGVar74->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019b0ad1:
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar74->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar181 = ZEXT1664(auVar181._0_16_);
                        auVar186 = ZEXT1664(auVar186._0_16_);
                        (*p_Var15)(&local_518);
                        auVar193 = ZEXT3264(local_440);
                        auVar205 = ZEXT3264(local_460);
                        auVar190 = ZEXT1664(local_4e0);
                        auVar208 = ZEXT464(0x35000000);
                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar207 = ZEXT1664(auVar83);
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar206 = ZEXT3264(auVar93);
                        ray = local_548;
                        context = local_540;
                        if (*local_518.valid == 0) goto LAB_019b0b95;
                      }
                      (((Vec3f *)((long)local_518.ray + 0x30))->field_0).components[0] =
                           *(float *)local_518.hit;
                      (((Vec3f *)((long)local_518.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_518.hit + 4);
                      (((Vec3f *)((long)local_518.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_518.hit + 8);
                      *(float *)((long)local_518.ray + 0x3c) = *(float *)(local_518.hit + 0xc);
                      *(float *)((long)local_518.ray + 0x40) = *(float *)(local_518.hit + 0x10);
                      *(float *)((long)local_518.ray + 0x44) = *(float *)(local_518.hit + 0x14);
                      *(float *)((long)local_518.ray + 0x48) = *(float *)(local_518.hit + 0x18);
                      *(float *)((long)local_518.ray + 0x4c) = *(float *)(local_518.hit + 0x1c);
                      *(float *)((long)local_518.ray + 0x50) = *(float *)(local_518.hit + 0x20);
                    }
                    else {
                      auVar181 = ZEXT464((uint)fVar157);
                      auVar186 = ZEXT1664(auVar185);
                      (*pGVar74->intersectionFilterN)(&local_518);
                      auVar193 = ZEXT3264(local_440);
                      auVar205 = ZEXT3264(local_460);
                      auVar190 = ZEXT1664(local_4e0);
                      auVar208 = ZEXT464(0x35000000);
                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar207 = ZEXT1664(auVar83);
                      auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar206 = ZEXT3264(auVar93);
                      ray = local_548;
                      context = local_540;
                      if (*local_518.valid != 0) goto LAB_019b0ad1;
LAB_019b0b95:
                      auVar208 = ZEXT464(0x35000000);
                      (local_548->super_RayK<1>).tfar = (float)local_400._0_4_;
                      ray = local_548;
                      context = local_540;
                    }
                    auVar99 = auVar205._0_32_;
                    bVar79 = ~(byte)(1 << ((uint)uVar69 & 0x1f)) & (byte)uVar80;
                    fVar157 = (ray->super_RayK<1>).tfar;
                    auVar33._4_4_ = fVar157;
                    auVar33._0_4_ = fVar157;
                    auVar33._8_4_ = fVar157;
                    auVar33._12_4_ = fVar157;
                    auVar33._16_4_ = fVar157;
                    auVar33._20_4_ = fVar157;
                    auVar33._24_4_ = fVar157;
                    auVar33._28_4_ = fVar157;
                    uVar151 = vcmpps_avx512vl(auVar193._0_32_,auVar33,2);
                    pre = local_538;
                    prim = local_528;
                    pPVar76 = local_530;
                    if ((bVar79 & (byte)uVar151) == 0) goto LAB_019afcd8;
                    local_400 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    bVar79 = bVar79 & (byte)uVar151;
                    uVar80 = (ulong)bVar79;
                    auVar147._8_4_ = 0x7f800000;
                    auVar147._0_8_ = 0x7f8000007f800000;
                    auVar147._12_4_ = 0x7f800000;
                    auVar147._16_4_ = 0x7f800000;
                    auVar147._20_4_ = 0x7f800000;
                    auVar147._24_4_ = 0x7f800000;
                    auVar147._28_4_ = 0x7f800000;
                    auVar93 = vblendmps_avx512vl(auVar147,auVar193._0_32_);
                    auVar129._0_4_ =
                         (uint)(bVar79 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000
                    ;
                    bVar16 = (bool)(bVar79 >> 1 & 1);
                    auVar129._4_4_ = (uint)bVar16 * auVar93._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar79 >> 2 & 1);
                    auVar129._8_4_ = (uint)bVar16 * auVar93._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar79 >> 3 & 1);
                    auVar129._12_4_ = (uint)bVar16 * auVar93._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar79 >> 4 & 1);
                    auVar129._16_4_ = (uint)bVar16 * auVar93._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar79 >> 5 & 1);
                    auVar129._20_4_ = (uint)bVar16 * auVar93._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar79 >> 6 & 1);
                    auVar129._24_4_ = (uint)bVar16 * auVar93._24_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar129._28_4_ =
                         (uint)(bVar79 >> 7) * auVar93._28_4_ |
                         (uint)!(bool)(bVar79 >> 7) * 0x7f800000;
                    auVar93 = vshufps_avx(auVar129,auVar129,0xb1);
                    auVar93 = vminps_avx(auVar129,auVar93);
                    auVar91 = vshufpd_avx(auVar93,auVar93,5);
                    auVar93 = vminps_avx(auVar93,auVar91);
                    auVar91 = vpermpd_avx2(auVar93,0x4e);
                    auVar93 = vminps_avx(auVar93,auVar91);
                    uVar151 = vcmpps_avx512vl(auVar129,auVar93,0);
                    bVar68 = (byte)uVar151 & bVar79;
                    if (bVar68 != 0) {
                      bVar79 = bVar68;
                    }
                    uVar70 = 0;
                    for (uVar72 = (uint)bVar79; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000
                        ) {
                      uVar70 = uVar70 + 1;
                    }
                    uVar69 = (ulong)uVar70;
                  } while( true );
                }
                fVar157 = local_200[uVar69];
                fVar138 = *(float *)(local_1e0 + uVar69 * 4);
                fVar149 = 1.0 - fVar157;
                fVar148 = fVar149 * fVar149 * -3.0;
                auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149)),
                                          ZEXT416((uint)(fVar157 * fVar149)),ZEXT416(0xc0000000));
                auVar84 = vfmsub132ss_fma(ZEXT416((uint)(fVar157 * fVar149)),
                                          ZEXT416((uint)(fVar157 * fVar157)),ZEXT416(0x40000000));
                fVar149 = auVar83._0_4_ * 3.0;
                fVar150 = auVar84._0_4_ * 3.0;
                fVar168 = fVar157 * fVar157 * 3.0;
                auVar182._0_4_ = fVar168 * (float)local_4d0._0_4_;
                auVar182._4_4_ = fVar168 * (float)local_4d0._4_4_;
                auVar182._8_4_ = fVar168 * (float)uStack_4c8;
                auVar182._12_4_ = fVar168 * uStack_4c8._4_4_;
                auVar186 = ZEXT1664(auVar182);
                auVar158._4_4_ = fVar150;
                auVar158._0_4_ = fVar150;
                auVar158._8_4_ = fVar150;
                auVar158._12_4_ = fVar150;
                auVar83 = vfmadd132ps_fma(auVar158,auVar182,local_4c0);
                auVar169._4_4_ = fVar149;
                auVar169._0_4_ = fVar149;
                auVar169._8_4_ = fVar149;
                auVar169._12_4_ = fVar149;
                auVar83 = vfmadd132ps_fma(auVar169,auVar83,local_4b0);
                auVar159._4_4_ = fVar148;
                auVar159._0_4_ = fVar148;
                auVar159._8_4_ = fVar148;
                auVar159._12_4_ = fVar148;
                auVar181 = ZEXT464((uint)*(float *)(local_1c0 + uVar69 * 4));
                (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar69 * 4);
                auVar83 = vfmadd213ps_fma(auVar159,local_4e0,auVar83);
                uVar151 = vmovlps_avx(auVar83);
                *(undefined8 *)&(ray->Ng).field_0 = uVar151;
                fVar148 = (float)vextractps_avx(auVar83,2);
                (ray->Ng).field_0.field_0.z = fVar148;
                ray->u = fVar157;
                ray->v = fVar138;
                ray->primID = uVar13;
                ray->geomID = uVar70;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                pre = local_538;
                prim = local_528;
                pPVar76 = local_530;
              }
            }
          }
        }
      }
    }
LAB_019afcd8:
    if (8 < iVar14) {
      auVar93 = vpbroadcastd_avx512vl();
      auVar205 = ZEXT3264(auVar93);
      local_400._4_4_ = local_420._0_4_;
      local_400._0_4_ = local_420._0_4_;
      local_400._8_4_ = local_420._0_4_;
      local_400._12_4_ = local_420._0_4_;
      local_400._16_4_ = local_420._0_4_;
      local_400._20_4_ = local_420._0_4_;
      local_400._24_4_ = local_420._0_4_;
      local_400._28_4_ = local_420._0_4_;
      auVar144._8_4_ = 3;
      auVar144._0_8_ = 0x300000003;
      auVar144._12_4_ = 3;
      auVar144._16_4_ = 3;
      auVar144._20_4_ = 3;
      auVar144._24_4_ = 3;
      auVar144._28_4_ = 3;
      local_3e0 = vpermps_avx2(auVar144,local_3e0);
      local_120 = 1.0 / (float)local_4a0._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      lVar78 = 8;
      local_460 = auVar99;
LAB_019afd67:
      if (lVar78 < local_520) {
        auVar93 = vpbroadcastd_avx512vl();
        auVar93 = vpor_avx2(auVar93,_DAT_01fb4ba0);
        uVar22 = vpcmpgtd_avx512vl(auVar205._0_32_,auVar93);
        auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 * 4 + lVar77);
        auVar91 = *(undefined1 (*) [32])(lVar77 + 0x21fb768 + lVar78 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar77 + 0x21fbbec + lVar78 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar77 + 0x21fc070 + lVar78 * 4);
        auVar193._0_4_ = auVar102._0_4_ * (float)local_3a0._0_4_;
        auVar193._4_4_ = auVar102._4_4_ * (float)local_3a0._4_4_;
        auVar193._8_4_ = auVar102._8_4_ * fStack_398;
        auVar193._12_4_ = auVar102._12_4_ * fStack_394;
        auVar193._16_4_ = auVar102._16_4_ * fStack_390;
        auVar193._20_4_ = auVar102._20_4_ * fStack_38c;
        auVar193._28_36_ = auVar186._28_36_;
        auVar193._24_4_ = auVar102._24_4_ * fStack_388;
        auVar186._0_4_ = auVar102._0_4_ * (float)local_3c0._0_4_;
        auVar186._4_4_ = auVar102._4_4_ * (float)local_3c0._4_4_;
        auVar186._8_4_ = auVar102._8_4_ * fStack_3b8;
        auVar186._12_4_ = auVar102._12_4_ * fStack_3b4;
        auVar186._16_4_ = auVar102._16_4_ * fStack_3b0;
        auVar186._20_4_ = auVar102._20_4_ * fStack_3ac;
        auVar186._28_36_ = auVar181._28_36_;
        auVar186._24_4_ = auVar102._24_4_ * fStack_3a8;
        auVar94 = vmulps_avx512vl(local_100,auVar102);
        auVar92 = vfmadd231ps_avx512vl(auVar193._0_32_,auVar103,local_360);
        auVar95 = vfmadd231ps_avx512vl(auVar186._0_32_,auVar103,local_380);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar103,local_e0);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar91,local_320);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_340);
        auVar101 = vfmadd231ps_avx512vl(auVar94,auVar91,local_c0);
        auVar83 = vfmadd231ps_fma(auVar92,auVar93,local_2e0);
        auVar186 = ZEXT1664(auVar83);
        auVar84 = vfmadd231ps_fma(auVar95,auVar93,local_300);
        auVar181 = ZEXT1664(auVar84);
        auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 * 4 + lVar77);
        auVar92 = *(undefined1 (*) [32])(lVar77 + 0x21fdb88 + lVar78 * 4);
        auVar97 = vfmadd231ps_avx512vl(auVar101,auVar93,local_a0);
        auVar95 = *(undefined1 (*) [32])(lVar77 + 0x21fe00c + lVar78 * 4);
        auVar101 = *(undefined1 (*) [32])(lVar77 + 0x21fe490 + lVar78 * 4);
        auVar191._0_4_ = auVar101._0_4_ * (float)local_3a0._0_4_;
        auVar191._4_4_ = auVar101._4_4_ * (float)local_3a0._4_4_;
        auVar191._8_4_ = auVar101._8_4_ * fStack_398;
        auVar191._12_4_ = auVar101._12_4_ * fStack_394;
        auVar191._16_4_ = auVar101._16_4_ * fStack_390;
        auVar191._20_4_ = auVar101._20_4_ * fStack_38c;
        auVar191._28_36_ = auVar190._28_36_;
        auVar191._24_4_ = auVar101._24_4_ * fStack_388;
        auVar51._4_4_ = auVar101._4_4_ * (float)local_3c0._4_4_;
        auVar51._0_4_ = auVar101._0_4_ * (float)local_3c0._0_4_;
        auVar51._8_4_ = auVar101._8_4_ * fStack_3b8;
        auVar51._12_4_ = auVar101._12_4_ * fStack_3b4;
        auVar51._16_4_ = auVar101._16_4_ * fStack_3b0;
        auVar51._20_4_ = auVar101._20_4_ * fStack_3ac;
        auVar51._24_4_ = auVar101._24_4_ * fStack_3a8;
        auVar51._28_4_ = uStack_3a4;
        auVar98 = vmulps_avx512vl(local_100,auVar101);
        auVar96 = vfmadd231ps_avx512vl(auVar191._0_32_,auVar95,local_360);
        auVar90 = vfmadd231ps_avx512vl(auVar51,auVar95,local_380);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_e0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,local_320);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,local_340);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar92,local_c0);
        auVar6 = vfmadd231ps_fma(auVar96,auVar94,local_2e0);
        auVar190 = ZEXT1664(auVar6);
        auVar7 = vfmadd231ps_fma(auVar90,auVar94,local_300);
        auVar90 = vfmadd231ps_avx512vl(auVar98,auVar94,local_a0);
        auVar88 = vmaxps_avx512vl(auVar97,auVar90);
        auVar98 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar83));
        auVar96 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar84));
        auVar89 = vmulps_avx512vl(ZEXT1632(auVar84),auVar98);
        auVar99 = vmulps_avx512vl(ZEXT1632(auVar83),auVar96);
        auVar89 = vsubps_avx512vl(auVar89,auVar99);
        auVar99 = vmulps_avx512vl(auVar96,auVar96);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar98);
        auVar88 = vmulps_avx512vl(auVar88,auVar88);
        auVar88 = vmulps_avx512vl(auVar88,auVar99);
        auVar89 = vmulps_avx512vl(auVar89,auVar89);
        uVar151 = vcmpps_avx512vl(auVar89,auVar88,2);
        bVar79 = (byte)uVar22 & (byte)uVar151;
        if (bVar79 != 0) {
          auVar101 = vmulps_avx512vl(local_1a0,auVar101);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_180,auVar101);
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_160,auVar95);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_460,auVar92);
          auVar102 = vmulps_avx512vl(local_1a0,auVar102);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_180,auVar102);
          auVar91 = vfmadd213ps_avx512vl(auVar91,local_160,auVar103);
          auVar92 = vfmadd213ps_avx512vl(auVar93,local_460,auVar91);
          auVar93 = *(undefined1 (*) [32])(lVar77 + 0x21fc4f4 + lVar78 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar77 + 0x21fc978 + lVar78 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar77 + 0x21fcdfc + lVar78 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar77 + 0x21fd280 + lVar78 * 4);
          auVar95 = vmulps_avx512vl(_local_3a0,auVar102);
          auVar101 = vmulps_avx512vl(_local_3c0,auVar102);
          auVar102 = vmulps_avx512vl(local_1a0,auVar102);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar103,local_360);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,local_380);
          auVar103 = vfmadd231ps_avx512vl(auVar102,local_180,auVar103);
          auVar102 = vfmadd231ps_avx512vl(auVar95,auVar91,local_320);
          auVar95 = vfmadd231ps_avx512vl(auVar101,auVar91,local_340);
          auVar91 = vfmadd231ps_avx512vl(auVar103,local_160,auVar91);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar93,local_2e0);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,local_300);
          auVar8 = vfmadd231ps_fma(auVar91,auVar93,local_460);
          auVar93 = *(undefined1 (*) [32])(lVar77 + 0x21fe914 + lVar78 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar77 + 0x21ff21c + lVar78 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar77 + 0x21ff6a0 + lVar78 * 4);
          auVar101 = vmulps_avx512vl(_local_3a0,auVar103);
          auVar88 = vmulps_avx512vl(_local_3c0,auVar103);
          auVar103 = vmulps_avx512vl(local_1a0,auVar103);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar91,local_360);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,local_380);
          auVar103 = vfmadd231ps_avx512vl(auVar103,local_180,auVar91);
          auVar91 = *(undefined1 (*) [32])(lVar77 + 0x21fed98 + lVar78 * 4);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar91,local_320);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,local_340);
          auVar91 = vfmadd231ps_avx512vl(auVar103,local_160,auVar91);
          auVar103 = vfmadd231ps_avx512vl(auVar101,auVar93,local_2e0);
          auVar101 = vfmadd231ps_avx512vl(auVar88,auVar93,local_300);
          auVar91 = vfmadd231ps_avx512vl(auVar91,local_460,auVar93);
          auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar102,auVar88);
          vandps_avx512vl(auVar95,auVar88);
          auVar93 = vmaxps_avx(auVar88,auVar88);
          vandps_avx512vl(ZEXT1632(auVar8),auVar88);
          auVar93 = vmaxps_avx(auVar93,auVar88);
          uVar69 = vcmpps_avx512vl(auVar93,local_400,1);
          bVar16 = (bool)((byte)uVar69 & 1);
          auVar117._0_4_ = (float)((uint)bVar16 * auVar98._0_4_ | (uint)!bVar16 * auVar102._0_4_);
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar102._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar102._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar102._12_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar16 * auVar98._16_4_ | (uint)!bVar16 * auVar102._16_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar16 * auVar98._20_4_ | (uint)!bVar16 * auVar102._20_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar16 * auVar98._24_4_ | (uint)!bVar16 * auVar102._24_4_)
          ;
          bVar16 = SUB81(uVar69 >> 7,0);
          auVar117._28_4_ = (uint)bVar16 * auVar98._28_4_ | (uint)!bVar16 * auVar102._28_4_;
          bVar16 = (bool)((byte)uVar69 & 1);
          auVar118._0_4_ = (float)((uint)bVar16 * auVar96._0_4_ | (uint)!bVar16 * auVar95._0_4_);
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar16 * auVar96._4_4_ | (uint)!bVar16 * auVar95._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar16 * auVar96._8_4_ | (uint)!bVar16 * auVar95._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar16 * auVar96._12_4_ | (uint)!bVar16 * auVar95._12_4_);
          bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar118._16_4_ = (float)((uint)bVar16 * auVar96._16_4_ | (uint)!bVar16 * auVar95._16_4_);
          bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar118._20_4_ = (float)((uint)bVar16 * auVar96._20_4_ | (uint)!bVar16 * auVar95._20_4_);
          bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar118._24_4_ = (float)((uint)bVar16 * auVar96._24_4_ | (uint)!bVar16 * auVar95._24_4_);
          bVar16 = SUB81(uVar69 >> 7,0);
          auVar118._28_4_ = (uint)bVar16 * auVar96._28_4_ | (uint)!bVar16 * auVar95._28_4_;
          vandps_avx512vl(auVar103,auVar88);
          vandps_avx512vl(auVar101,auVar88);
          auVar93 = vmaxps_avx(auVar118,auVar118);
          vandps_avx512vl(auVar91,auVar88);
          auVar93 = vmaxps_avx(auVar93,auVar118);
          uVar69 = vcmpps_avx512vl(auVar93,local_400,1);
          bVar16 = (bool)((byte)uVar69 & 1);
          auVar119._0_4_ = (uint)bVar16 * auVar98._0_4_ | (uint)!bVar16 * auVar103._0_4_;
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar103._4_4_;
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar103._8_4_;
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar103._12_4_;
          bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar119._16_4_ = (uint)bVar16 * auVar98._16_4_ | (uint)!bVar16 * auVar103._16_4_;
          bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar119._20_4_ = (uint)bVar16 * auVar98._20_4_ | (uint)!bVar16 * auVar103._20_4_;
          bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar119._24_4_ = (uint)bVar16 * auVar98._24_4_ | (uint)!bVar16 * auVar103._24_4_;
          bVar16 = SUB81(uVar69 >> 7,0);
          auVar119._28_4_ = (uint)bVar16 * auVar98._28_4_ | (uint)!bVar16 * auVar103._28_4_;
          bVar16 = (bool)((byte)uVar69 & 1);
          auVar120._0_4_ = (float)((uint)bVar16 * auVar96._0_4_ | (uint)!bVar16 * auVar101._0_4_);
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar16 * auVar96._4_4_ | (uint)!bVar16 * auVar101._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar16 * auVar96._8_4_ | (uint)!bVar16 * auVar101._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar16 * auVar96._12_4_ | (uint)!bVar16 * auVar101._12_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar16 * auVar96._16_4_ | (uint)!bVar16 * auVar101._16_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar16 * auVar96._20_4_ | (uint)!bVar16 * auVar101._20_4_)
          ;
          bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar16 * auVar96._24_4_ | (uint)!bVar16 * auVar101._24_4_)
          ;
          bVar16 = SUB81(uVar69 >> 7,0);
          auVar120._28_4_ = (uint)bVar16 * auVar96._28_4_ | (uint)!bVar16 * auVar101._28_4_;
          auVar195._8_4_ = 0x80000000;
          auVar195._0_8_ = 0x8000000080000000;
          auVar195._12_4_ = 0x80000000;
          auVar195._16_4_ = 0x80000000;
          auVar195._20_4_ = 0x80000000;
          auVar195._24_4_ = 0x80000000;
          auVar195._28_4_ = 0x80000000;
          auVar93 = vxorps_avx512vl(auVar119,auVar195);
          auVar87 = vxorps_avx512vl(auVar88._0_16_,auVar88._0_16_);
          auVar91 = vfmadd213ps_avx512vl(auVar117,auVar117,ZEXT1632(auVar87));
          auVar8 = vfmadd231ps_fma(auVar91,auVar118,auVar118);
          auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar8));
          auVar204._8_4_ = 0xbf000000;
          auVar204._0_8_ = 0xbf000000bf000000;
          auVar204._12_4_ = 0xbf000000;
          auVar204._16_4_ = 0xbf000000;
          auVar204._20_4_ = 0xbf000000;
          auVar204._24_4_ = 0xbf000000;
          auVar204._28_4_ = 0xbf000000;
          fVar157 = auVar91._0_4_;
          fVar138 = auVar91._4_4_;
          fVar148 = auVar91._8_4_;
          fVar149 = auVar91._12_4_;
          fVar150 = auVar91._16_4_;
          fVar168 = auVar91._20_4_;
          fVar81 = auVar91._24_4_;
          auVar52._4_4_ = fVar138 * fVar138 * fVar138 * auVar8._4_4_ * -0.5;
          auVar52._0_4_ = fVar157 * fVar157 * fVar157 * auVar8._0_4_ * -0.5;
          auVar52._8_4_ = fVar148 * fVar148 * fVar148 * auVar8._8_4_ * -0.5;
          auVar52._12_4_ = fVar149 * fVar149 * fVar149 * auVar8._12_4_ * -0.5;
          auVar52._16_4_ = fVar150 * fVar150 * fVar150 * -0.0;
          auVar52._20_4_ = fVar168 * fVar168 * fVar168 * -0.0;
          auVar52._24_4_ = fVar81 * fVar81 * fVar81 * -0.0;
          auVar52._28_4_ = auVar118._28_4_;
          auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar91 = vfmadd231ps_avx512vl(auVar52,auVar103,auVar91);
          auVar53._4_4_ = auVar118._4_4_ * auVar91._4_4_;
          auVar53._0_4_ = auVar118._0_4_ * auVar91._0_4_;
          auVar53._8_4_ = auVar118._8_4_ * auVar91._8_4_;
          auVar53._12_4_ = auVar118._12_4_ * auVar91._12_4_;
          auVar53._16_4_ = auVar118._16_4_ * auVar91._16_4_;
          auVar53._20_4_ = auVar118._20_4_ * auVar91._20_4_;
          auVar53._24_4_ = auVar118._24_4_ * auVar91._24_4_;
          auVar53._28_4_ = 0;
          auVar54._4_4_ = auVar91._4_4_ * -auVar117._4_4_;
          auVar54._0_4_ = auVar91._0_4_ * -auVar117._0_4_;
          auVar54._8_4_ = auVar91._8_4_ * -auVar117._8_4_;
          auVar54._12_4_ = auVar91._12_4_ * -auVar117._12_4_;
          auVar54._16_4_ = auVar91._16_4_ * -auVar117._16_4_;
          auVar54._20_4_ = auVar91._20_4_ * -auVar117._20_4_;
          auVar54._24_4_ = auVar91._24_4_ * -auVar117._24_4_;
          auVar54._28_4_ = auVar118._28_4_;
          auVar102 = vmulps_avx512vl(auVar91,ZEXT1632(auVar87));
          auVar101 = ZEXT1632(auVar87);
          auVar91 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar101);
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar120,auVar120);
          auVar95 = vrsqrt14ps_avx512vl(auVar91);
          auVar91 = vmulps_avx512vl(auVar91,auVar204);
          fVar157 = auVar95._0_4_;
          fVar138 = auVar95._4_4_;
          fVar148 = auVar95._8_4_;
          fVar149 = auVar95._12_4_;
          fVar150 = auVar95._16_4_;
          fVar168 = auVar95._20_4_;
          fVar81 = auVar95._24_4_;
          auVar55._4_4_ = fVar138 * fVar138 * fVar138 * auVar91._4_4_;
          auVar55._0_4_ = fVar157 * fVar157 * fVar157 * auVar91._0_4_;
          auVar55._8_4_ = fVar148 * fVar148 * fVar148 * auVar91._8_4_;
          auVar55._12_4_ = fVar149 * fVar149 * fVar149 * auVar91._12_4_;
          auVar55._16_4_ = fVar150 * fVar150 * fVar150 * auVar91._16_4_;
          auVar55._20_4_ = fVar168 * fVar168 * fVar168 * auVar91._20_4_;
          auVar55._24_4_ = fVar81 * fVar81 * fVar81 * auVar91._24_4_;
          auVar55._28_4_ = auVar91._28_4_;
          auVar91 = vfmadd231ps_avx512vl(auVar55,auVar103,auVar95);
          auVar56._4_4_ = auVar120._4_4_ * auVar91._4_4_;
          auVar56._0_4_ = auVar120._0_4_ * auVar91._0_4_;
          auVar56._8_4_ = auVar120._8_4_ * auVar91._8_4_;
          auVar56._12_4_ = auVar120._12_4_ * auVar91._12_4_;
          auVar56._16_4_ = auVar120._16_4_ * auVar91._16_4_;
          auVar56._20_4_ = auVar120._20_4_ * auVar91._20_4_;
          auVar56._24_4_ = auVar120._24_4_ * auVar91._24_4_;
          auVar56._28_4_ = auVar95._28_4_;
          auVar57._4_4_ = auVar91._4_4_ * auVar93._4_4_;
          auVar57._0_4_ = auVar91._0_4_ * auVar93._0_4_;
          auVar57._8_4_ = auVar91._8_4_ * auVar93._8_4_;
          auVar57._12_4_ = auVar91._12_4_ * auVar93._12_4_;
          auVar57._16_4_ = auVar91._16_4_ * auVar93._16_4_;
          auVar57._20_4_ = auVar91._20_4_ * auVar93._20_4_;
          auVar57._24_4_ = auVar91._24_4_ * auVar93._24_4_;
          auVar57._28_4_ = auVar93._28_4_;
          auVar93 = vmulps_avx512vl(auVar91,auVar101);
          auVar8 = vfmadd213ps_fma(auVar53,auVar97,ZEXT1632(auVar83));
          auVar9 = vfmadd213ps_fma(auVar54,auVar97,ZEXT1632(auVar84));
          auVar103 = vfmadd213ps_avx512vl(auVar102,auVar97,auVar92);
          auVar95 = vfmadd213ps_avx512vl(auVar56,auVar90,ZEXT1632(auVar6));
          auVar11 = vfnmadd213ps_fma(auVar53,auVar97,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar57,auVar90,ZEXT1632(auVar7));
          auVar12 = vfnmadd213ps_fma(auVar54,auVar97,ZEXT1632(auVar84));
          auVar84 = vfmadd213ps_fma(auVar93,auVar90,auVar94);
          auVar154 = vfnmadd231ps_fma(auVar92,auVar97,auVar102);
          auVar152 = vfnmadd213ps_fma(auVar56,auVar90,ZEXT1632(auVar6));
          auVar153 = vfnmadd213ps_fma(auVar57,auVar90,ZEXT1632(auVar7));
          auVar85 = vfnmadd231ps_fma(auVar94,auVar90,auVar93);
          auVar94 = vsubps_avx512vl(auVar95,ZEXT1632(auVar11));
          auVar93 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar12));
          auVar91 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar154));
          auVar58._4_4_ = auVar93._4_4_ * auVar154._4_4_;
          auVar58._0_4_ = auVar93._0_4_ * auVar154._0_4_;
          auVar58._8_4_ = auVar93._8_4_ * auVar154._8_4_;
          auVar58._12_4_ = auVar93._12_4_ * auVar154._12_4_;
          auVar58._16_4_ = auVar93._16_4_ * 0.0;
          auVar58._20_4_ = auVar93._20_4_ * 0.0;
          auVar58._24_4_ = auVar93._24_4_ * 0.0;
          auVar58._28_4_ = auVar102._28_4_;
          auVar6 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar12),auVar91);
          auVar59._4_4_ = auVar91._4_4_ * auVar11._4_4_;
          auVar59._0_4_ = auVar91._0_4_ * auVar11._0_4_;
          auVar59._8_4_ = auVar91._8_4_ * auVar11._8_4_;
          auVar59._12_4_ = auVar91._12_4_ * auVar11._12_4_;
          auVar59._16_4_ = auVar91._16_4_ * 0.0;
          auVar59._20_4_ = auVar91._20_4_ * 0.0;
          auVar59._24_4_ = auVar91._24_4_ * 0.0;
          auVar59._28_4_ = auVar91._28_4_;
          auVar7 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar154),auVar94);
          auVar60._4_4_ = auVar12._4_4_ * auVar94._4_4_;
          auVar60._0_4_ = auVar12._0_4_ * auVar94._0_4_;
          auVar60._8_4_ = auVar12._8_4_ * auVar94._8_4_;
          auVar60._12_4_ = auVar12._12_4_ * auVar94._12_4_;
          auVar60._16_4_ = auVar94._16_4_ * 0.0;
          auVar60._20_4_ = auVar94._20_4_ * 0.0;
          auVar60._24_4_ = auVar94._24_4_ * 0.0;
          auVar60._28_4_ = auVar94._28_4_;
          auVar10 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar11),auVar93);
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar101,ZEXT1632(auVar7));
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar101,ZEXT1632(auVar6));
          auVar89 = ZEXT1632(auVar87);
          uVar69 = vcmpps_avx512vl(auVar93,auVar89,2);
          bVar68 = (byte)uVar69;
          fVar130 = (float)((uint)(bVar68 & 1) * auVar8._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar152._0_4_);
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar132 = (float)((uint)bVar16 * auVar8._4_4_ | (uint)!bVar16 * auVar152._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar135 = (float)((uint)bVar16 * auVar8._8_4_ | (uint)!bVar16 * auVar152._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar136 = (float)((uint)bVar16 * auVar8._12_4_ | (uint)!bVar16 * auVar152._12_4_);
          auVar101 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar135,CONCAT44(fVar132,fVar130))));
          fVar131 = (float)((uint)(bVar68 & 1) * auVar9._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar153._0_4_);
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar134 = (float)((uint)bVar16 * auVar9._4_4_ | (uint)!bVar16 * auVar153._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar133 = (float)((uint)bVar16 * auVar9._8_4_ | (uint)!bVar16 * auVar153._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar137 = (float)((uint)bVar16 * auVar9._12_4_ | (uint)!bVar16 * auVar153._12_4_);
          auVar98 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar133,CONCAT44(fVar134,fVar131))));
          auVar121._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar85._0_4_);
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * auVar85._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * auVar85._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * auVar85._12_4_)
          ;
          fVar157 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar103._16_4_);
          auVar121._16_4_ = fVar157;
          fVar148 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar103._20_4_);
          auVar121._20_4_ = fVar148;
          fVar138 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar103._24_4_);
          auVar121._24_4_ = fVar138;
          iVar1 = (uint)(byte)(uVar69 >> 7) * auVar103._28_4_;
          auVar121._28_4_ = iVar1;
          auVar93 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar95);
          auVar122._0_4_ =
               (uint)(bVar68 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar6._0_4_;
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar16 * auVar93._4_4_ | (uint)!bVar16 * auVar6._4_4_;
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar16 * auVar93._8_4_ | (uint)!bVar16 * auVar6._8_4_;
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar16 * auVar93._12_4_ | (uint)!bVar16 * auVar6._12_4_;
          auVar122._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar93._16_4_;
          auVar122._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar93._20_4_;
          auVar122._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar93._24_4_;
          auVar122._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar93._28_4_;
          auVar93 = vblendmps_avx512vl(ZEXT1632(auVar12),ZEXT1632(auVar83));
          auVar123._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar8._0_4_
                      );
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar16 * auVar93._4_4_ | (uint)!bVar16 * auVar8._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar16 * auVar93._8_4_ | (uint)!bVar16 * auVar8._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar16 * auVar93._12_4_ | (uint)!bVar16 * auVar8._12_4_);
          fVar168 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar93._16_4_);
          auVar123._16_4_ = fVar168;
          fVar150 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar93._20_4_);
          auVar123._20_4_ = fVar150;
          fVar149 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar93._24_4_);
          auVar123._24_4_ = fVar149;
          auVar123._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar93._28_4_;
          auVar93 = vblendmps_avx512vl(ZEXT1632(auVar154),ZEXT1632(auVar84));
          auVar124._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar9._0_4_
                      );
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar16 * auVar93._4_4_ | (uint)!bVar16 * auVar9._4_4_);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar16 * auVar93._8_4_ | (uint)!bVar16 * auVar9._8_4_);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar16 * auVar93._12_4_ | (uint)!bVar16 * auVar9._12_4_);
          fVar156 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar93._16_4_);
          auVar124._16_4_ = fVar156;
          fVar82 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar93._20_4_);
          auVar124._20_4_ = fVar82;
          fVar81 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar93._24_4_);
          auVar124._24_4_ = fVar81;
          iVar2 = (uint)(byte)(uVar69 >> 7) * auVar93._28_4_;
          auVar124._28_4_ = iVar2;
          auVar125._0_4_ =
               (uint)(bVar68 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar95._0_4_;
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar16 * (int)auVar11._4_4_ | (uint)!bVar16 * auVar95._4_4_;
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar16 * (int)auVar11._8_4_ | (uint)!bVar16 * auVar95._8_4_;
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar16 * (int)auVar11._12_4_ | (uint)!bVar16 * auVar95._12_4_;
          auVar125._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar95._16_4_;
          auVar125._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar95._20_4_;
          auVar125._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar95._24_4_;
          auVar125._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar95._28_4_;
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar69 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar95 = vsubps_avx512vl(auVar125,auVar101);
          auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar12._12_4_ |
                                                  (uint)!bVar20 * auVar83._12_4_,
                                                  CONCAT48((uint)bVar18 * (int)auVar12._8_4_ |
                                                           (uint)!bVar18 * auVar83._8_4_,
                                                           CONCAT44((uint)bVar16 *
                                                                    (int)auVar12._4_4_ |
                                                                    (uint)!bVar16 * auVar83._4_4_,
                                                                    (uint)(bVar68 & 1) *
                                                                    (int)auVar12._0_4_ |
                                                                    (uint)!(bool)(bVar68 & 1) *
                                                                    auVar83._0_4_)))),auVar98);
          auVar186 = ZEXT3264(auVar91);
          auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar154._12_4_ |
                                                   (uint)!bVar21 * auVar84._12_4_,
                                                   CONCAT48((uint)bVar19 * (int)auVar154._8_4_ |
                                                            (uint)!bVar19 * auVar84._8_4_,
                                                            CONCAT44((uint)bVar17 *
                                                                     (int)auVar154._4_4_ |
                                                                     (uint)!bVar17 * auVar84._4_4_,
                                                                     (uint)(bVar68 & 1) *
                                                                     (int)auVar154._0_4_ |
                                                                     (uint)!(bool)(bVar68 & 1) *
                                                                     auVar84._0_4_)))),auVar121);
          auVar102 = vsubps_avx(auVar101,auVar122);
          auVar190 = ZEXT3264(auVar102);
          auVar94 = vsubps_avx(auVar98,auVar123);
          auVar92 = vsubps_avx(auVar121,auVar124);
          auVar61._4_4_ = auVar103._4_4_ * fVar132;
          auVar61._0_4_ = auVar103._0_4_ * fVar130;
          auVar61._8_4_ = auVar103._8_4_ * fVar135;
          auVar61._12_4_ = auVar103._12_4_ * fVar136;
          auVar61._16_4_ = auVar103._16_4_ * 0.0;
          auVar61._20_4_ = auVar103._20_4_ * 0.0;
          auVar61._24_4_ = auVar103._24_4_ * 0.0;
          auVar61._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar61,auVar121,auVar95);
          auVar174._0_4_ = fVar131 * auVar95._0_4_;
          auVar174._4_4_ = fVar134 * auVar95._4_4_;
          auVar174._8_4_ = fVar133 * auVar95._8_4_;
          auVar174._12_4_ = fVar137 * auVar95._12_4_;
          auVar174._16_4_ = auVar95._16_4_ * 0.0;
          auVar174._20_4_ = auVar95._20_4_ * 0.0;
          auVar174._24_4_ = auVar95._24_4_ * 0.0;
          auVar174._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar174,auVar101,auVar91);
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar89,ZEXT1632(auVar83));
          auVar179._0_4_ = auVar91._0_4_ * auVar121._0_4_;
          auVar179._4_4_ = auVar91._4_4_ * auVar121._4_4_;
          auVar179._8_4_ = auVar91._8_4_ * auVar121._8_4_;
          auVar179._12_4_ = auVar91._12_4_ * auVar121._12_4_;
          auVar179._16_4_ = auVar91._16_4_ * fVar157;
          auVar179._20_4_ = auVar91._20_4_ * fVar148;
          auVar179._24_4_ = auVar91._24_4_ * fVar138;
          auVar179._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar179,auVar98,auVar103);
          auVar96 = vfmadd231ps_avx512vl(auVar93,auVar89,ZEXT1632(auVar83));
          auVar93 = vmulps_avx512vl(auVar92,auVar122);
          auVar93 = vfmsub231ps_avx512vl(auVar93,auVar102,auVar124);
          auVar62._4_4_ = auVar94._4_4_ * auVar124._4_4_;
          auVar62._0_4_ = auVar94._0_4_ * auVar124._0_4_;
          auVar62._8_4_ = auVar94._8_4_ * auVar124._8_4_;
          auVar62._12_4_ = auVar94._12_4_ * auVar124._12_4_;
          auVar62._16_4_ = auVar94._16_4_ * fVar156;
          auVar62._20_4_ = auVar94._20_4_ * fVar82;
          auVar62._24_4_ = auVar94._24_4_ * fVar81;
          auVar62._28_4_ = iVar2;
          auVar83 = vfmsub231ps_fma(auVar62,auVar123,auVar92);
          auVar180._0_4_ = auVar123._0_4_ * auVar102._0_4_;
          auVar180._4_4_ = auVar123._4_4_ * auVar102._4_4_;
          auVar180._8_4_ = auVar123._8_4_ * auVar102._8_4_;
          auVar180._12_4_ = auVar123._12_4_ * auVar102._12_4_;
          auVar180._16_4_ = fVar168 * auVar102._16_4_;
          auVar180._20_4_ = fVar150 * auVar102._20_4_;
          auVar180._24_4_ = fVar149 * auVar102._24_4_;
          auVar180._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar180,auVar94,auVar122);
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar89,auVar93);
          auVar88 = vfmadd231ps_avx512vl(auVar93,auVar89,ZEXT1632(auVar83));
          auVar181 = ZEXT3264(auVar88);
          auVar93 = vmaxps_avx(auVar96,auVar88);
          uVar151 = vcmpps_avx512vl(auVar93,auVar89,2);
          bVar79 = bVar79 & (byte)uVar151;
          if (bVar79 != 0) {
            auVar63._4_4_ = auVar92._4_4_ * auVar91._4_4_;
            auVar63._0_4_ = auVar92._0_4_ * auVar91._0_4_;
            auVar63._8_4_ = auVar92._8_4_ * auVar91._8_4_;
            auVar63._12_4_ = auVar92._12_4_ * auVar91._12_4_;
            auVar63._16_4_ = auVar92._16_4_ * auVar91._16_4_;
            auVar63._20_4_ = auVar92._20_4_ * auVar91._20_4_;
            auVar63._24_4_ = auVar92._24_4_ * auVar91._24_4_;
            auVar63._28_4_ = auVar93._28_4_;
            auVar7 = vfmsub231ps_fma(auVar63,auVar94,auVar103);
            auVar64._4_4_ = auVar103._4_4_ * auVar102._4_4_;
            auVar64._0_4_ = auVar103._0_4_ * auVar102._0_4_;
            auVar64._8_4_ = auVar103._8_4_ * auVar102._8_4_;
            auVar64._12_4_ = auVar103._12_4_ * auVar102._12_4_;
            auVar64._16_4_ = auVar103._16_4_ * auVar102._16_4_;
            auVar64._20_4_ = auVar103._20_4_ * auVar102._20_4_;
            auVar64._24_4_ = auVar103._24_4_ * auVar102._24_4_;
            auVar64._28_4_ = auVar103._28_4_;
            auVar6 = vfmsub231ps_fma(auVar64,auVar95,auVar92);
            auVar65._4_4_ = auVar94._4_4_ * auVar95._4_4_;
            auVar65._0_4_ = auVar94._0_4_ * auVar95._0_4_;
            auVar65._8_4_ = auVar94._8_4_ * auVar95._8_4_;
            auVar65._12_4_ = auVar94._12_4_ * auVar95._12_4_;
            auVar65._16_4_ = auVar94._16_4_ * auVar95._16_4_;
            auVar65._20_4_ = auVar94._20_4_ * auVar95._20_4_;
            auVar65._24_4_ = auVar94._24_4_ * auVar95._24_4_;
            auVar65._28_4_ = auVar94._28_4_;
            auVar8 = vfmsub231ps_fma(auVar65,auVar102,auVar91);
            auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar8));
            auVar84 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar7),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar93 = vrcp14ps_avx512vl(ZEXT1632(auVar84));
            auVar190 = ZEXT3264(auVar93);
            auVar28._8_4_ = 0x3f800000;
            auVar28._0_8_ = 0x3f8000003f800000;
            auVar28._12_4_ = 0x3f800000;
            auVar28._16_4_ = 0x3f800000;
            auVar28._20_4_ = 0x3f800000;
            auVar28._24_4_ = 0x3f800000;
            auVar28._28_4_ = 0x3f800000;
            auVar91 = vfnmadd213ps_avx512vl(auVar93,ZEXT1632(auVar84),auVar28);
            auVar83 = vfmadd132ps_fma(auVar91,auVar93,auVar93);
            auVar186 = ZEXT1664(auVar83);
            auVar66._4_4_ = auVar8._4_4_ * auVar121._4_4_;
            auVar66._0_4_ = auVar8._0_4_ * auVar121._0_4_;
            auVar66._8_4_ = auVar8._8_4_ * auVar121._8_4_;
            auVar66._12_4_ = auVar8._12_4_ * auVar121._12_4_;
            auVar66._16_4_ = fVar157 * 0.0;
            auVar66._20_4_ = fVar148 * 0.0;
            auVar66._24_4_ = fVar138 * 0.0;
            auVar66._28_4_ = iVar1;
            auVar6 = vfmadd231ps_fma(auVar66,auVar98,ZEXT1632(auVar6));
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar101,ZEXT1632(auVar7));
            fVar138 = auVar83._0_4_;
            fVar148 = auVar83._4_4_;
            fVar149 = auVar83._8_4_;
            fVar150 = auVar83._12_4_;
            local_280 = ZEXT1632(CONCAT412(auVar6._12_4_ * fVar150,
                                           CONCAT48(auVar6._8_4_ * fVar149,
                                                    CONCAT44(auVar6._4_4_ * fVar148,
                                                             auVar6._0_4_ * fVar138))));
            auVar193 = ZEXT3264(local_280);
            uVar151 = vcmpps_avx512vl(local_280,local_3e0,0xd);
            fVar157 = (ray->super_RayK<1>).tfar;
            auVar29._4_4_ = fVar157;
            auVar29._0_4_ = fVar157;
            auVar29._8_4_ = fVar157;
            auVar29._12_4_ = fVar157;
            auVar29._16_4_ = fVar157;
            auVar29._20_4_ = fVar157;
            auVar29._24_4_ = fVar157;
            auVar29._28_4_ = fVar157;
            uVar22 = vcmpps_avx512vl(local_280,auVar29,2);
            bVar79 = (byte)uVar151 & (byte)uVar22 & bVar79;
            if (bVar79 != 0) {
              uVar80 = vcmpps_avx512vl(ZEXT1632(auVar84),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar80 = bVar79 & uVar80;
              if ((char)uVar80 != '\0') {
                fVar157 = auVar96._0_4_ * fVar138;
                fVar168 = auVar96._4_4_ * fVar148;
                auVar67._4_4_ = fVar168;
                auVar67._0_4_ = fVar157;
                fVar81 = auVar96._8_4_ * fVar149;
                auVar67._8_4_ = fVar81;
                fVar82 = auVar96._12_4_ * fVar150;
                auVar67._12_4_ = fVar82;
                fVar156 = auVar96._16_4_ * 0.0;
                auVar67._16_4_ = fVar156;
                fVar130 = auVar96._20_4_ * 0.0;
                auVar67._20_4_ = fVar130;
                fVar131 = auVar96._24_4_ * 0.0;
                auVar67._24_4_ = fVar131;
                auVar67._28_4_ = auVar96._28_4_;
                auVar167._8_4_ = 0x3f800000;
                auVar167._0_8_ = 0x3f8000003f800000;
                auVar167._12_4_ = 0x3f800000;
                auVar167._16_4_ = 0x3f800000;
                auVar167._20_4_ = 0x3f800000;
                auVar167._24_4_ = 0x3f800000;
                auVar167._28_4_ = 0x3f800000;
                auVar93 = vsubps_avx(auVar167,auVar67);
                local_2c0._0_4_ =
                     (float)((uint)(bVar68 & 1) * (int)fVar157 |
                            (uint)!(bool)(bVar68 & 1) * auVar93._0_4_);
                bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar16 * (int)fVar168 | (uint)!bVar16 * auVar93._4_4_);
                bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar16 * (int)fVar81 | (uint)!bVar16 * auVar93._8_4_);
                bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar16 * (int)fVar82 | (uint)!bVar16 * auVar93._12_4_);
                bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar16 * (int)fVar156 | (uint)!bVar16 * auVar93._16_4_);
                bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar16 * (int)fVar130 | (uint)!bVar16 * auVar93._20_4_);
                bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar16 * (int)fVar131 | (uint)!bVar16 * auVar93._24_4_);
                bVar16 = SUB81(uVar69 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar16 * auVar96._28_4_ | (uint)!bVar16 * auVar93._28_4_);
                auVar93 = vsubps_avx(auVar90,auVar97);
                auVar83 = vfmadd213ps_fma(auVar93,local_2c0,auVar97);
                fVar157 = pre->depth_scale;
                auVar30._4_4_ = fVar157;
                auVar30._0_4_ = fVar157;
                auVar30._8_4_ = fVar157;
                auVar30._12_4_ = fVar157;
                auVar30._16_4_ = fVar157;
                auVar30._20_4_ = fVar157;
                auVar30._24_4_ = fVar157;
                auVar30._28_4_ = fVar157;
                auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                             CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                                      CONCAT44(auVar83._4_4_ +
                                                                               auVar83._4_4_,
                                                                               auVar83._0_4_ +
                                                                               auVar83._0_4_)))),
                                          auVar30);
                uVar73 = vcmpps_avx512vl(local_280,auVar93,6);
                uVar80 = uVar80 & uVar73;
                bVar79 = (byte)uVar80;
                if (bVar79 != 0) {
                  auVar155._0_4_ = auVar88._0_4_ * fVar138;
                  auVar155._4_4_ = auVar88._4_4_ * fVar148;
                  auVar155._8_4_ = auVar88._8_4_ * fVar149;
                  auVar155._12_4_ = auVar88._12_4_ * fVar150;
                  auVar155._16_4_ = auVar88._16_4_ * 0.0;
                  auVar155._20_4_ = auVar88._20_4_ * 0.0;
                  auVar155._24_4_ = auVar88._24_4_ * 0.0;
                  auVar155._28_4_ = 0;
                  auVar175._8_4_ = 0x3f800000;
                  auVar175._0_8_ = 0x3f8000003f800000;
                  auVar175._12_4_ = 0x3f800000;
                  auVar175._16_4_ = 0x3f800000;
                  auVar175._20_4_ = 0x3f800000;
                  auVar175._24_4_ = 0x3f800000;
                  auVar175._28_4_ = 0x3f800000;
                  auVar93 = vsubps_avx(auVar175,auVar155);
                  auVar126._0_4_ =
                       (uint)(bVar68 & 1) * (int)auVar155._0_4_ |
                       (uint)!(bool)(bVar68 & 1) * auVar93._0_4_;
                  bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
                  auVar126._4_4_ =
                       (uint)bVar16 * (int)auVar155._4_4_ | (uint)!bVar16 * auVar93._4_4_;
                  bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
                  auVar126._8_4_ =
                       (uint)bVar16 * (int)auVar155._8_4_ | (uint)!bVar16 * auVar93._8_4_;
                  bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
                  auVar126._12_4_ =
                       (uint)bVar16 * (int)auVar155._12_4_ | (uint)!bVar16 * auVar93._12_4_;
                  bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
                  auVar126._16_4_ =
                       (uint)bVar16 * (int)auVar155._16_4_ | (uint)!bVar16 * auVar93._16_4_;
                  bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
                  auVar126._20_4_ =
                       (uint)bVar16 * (int)auVar155._20_4_ | (uint)!bVar16 * auVar93._20_4_;
                  bVar16 = (bool)((byte)(uVar69 >> 6) & 1);
                  auVar126._24_4_ =
                       (uint)bVar16 * (int)auVar155._24_4_ | (uint)!bVar16 * auVar93._24_4_;
                  auVar126._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar93._28_4_;
                  auVar31._8_4_ = 0x40000000;
                  auVar31._0_8_ = 0x4000000040000000;
                  auVar31._12_4_ = 0x40000000;
                  auVar31._16_4_ = 0x40000000;
                  auVar31._20_4_ = 0x40000000;
                  auVar31._24_4_ = 0x40000000;
                  auVar31._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar126,auVar175,auVar31);
                  local_260 = (int)lVar78;
                  local_25c = iVar14;
                  auVar190 = ZEXT1664(local_4e0);
                  local_250 = local_4e0;
                  local_240 = local_4b0._0_8_;
                  uStack_238 = local_4b0._8_8_;
                  local_230 = local_4c0._0_8_;
                  uStack_228 = local_4c0._8_8_;
                  local_220 = local_4d0;
                  uStack_218 = uStack_4c8;
                  pGVar74 = (context->scene->geometries).items[local_550].ptr;
                  if ((pGVar74->mask & (ray->super_RayK<1>).mask) != 0) {
                    uVar72 = (uint)uVar80;
                    auVar83 = vcvtsi2ss_avx512f(auVar87,(int)lVar78);
                    fVar157 = auVar83._0_4_;
                    local_200[0] = (fVar157 + local_2c0._0_4_ + 0.0) * local_120;
                    local_200[1] = (fVar157 + local_2c0._4_4_ + 1.0) * fStack_11c;
                    local_200[2] = (fVar157 + local_2c0._8_4_ + 2.0) * fStack_118;
                    local_200[3] = (fVar157 + local_2c0._12_4_ + 3.0) * fStack_114;
                    fStack_1f0 = (fVar157 + local_2c0._16_4_ + 4.0) * fStack_110;
                    fStack_1ec = (fVar157 + local_2c0._20_4_ + 5.0) * fStack_10c;
                    fStack_1e8 = (fVar157 + local_2c0._24_4_ + 6.0) * fStack_108;
                    fStack_1e4 = fVar157 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar145._8_4_ = 0x7f800000;
                    auVar145._0_8_ = 0x7f8000007f800000;
                    auVar145._12_4_ = 0x7f800000;
                    auVar145._16_4_ = 0x7f800000;
                    auVar145._20_4_ = 0x7f800000;
                    auVar145._24_4_ = 0x7f800000;
                    auVar145._28_4_ = 0x7f800000;
                    auVar93 = vblendmps_avx512vl(auVar145,local_280);
                    auVar127._0_4_ =
                         (uint)(bVar79 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000
                    ;
                    bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
                    auVar127._4_4_ = (uint)bVar16 * auVar93._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                    auVar127._8_4_ = (uint)bVar16 * auVar93._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
                    auVar127._12_4_ = (uint)bVar16 * auVar93._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
                    auVar127._16_4_ = (uint)bVar16 * auVar93._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                    auVar127._20_4_ = (uint)bVar16 * auVar93._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
                    auVar127._24_4_ = (uint)bVar16 * auVar93._24_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = SUB81(uVar80 >> 7,0);
                    auVar127._28_4_ = (uint)bVar16 * auVar93._28_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar93 = vshufps_avx(auVar127,auVar127,0xb1);
                    auVar93 = vminps_avx(auVar127,auVar93);
                    auVar91 = vshufpd_avx(auVar93,auVar93,5);
                    auVar93 = vminps_avx(auVar93,auVar91);
                    auVar91 = vpermpd_avx2(auVar93,0x4e);
                    auVar93 = vminps_avx(auVar93,auVar91);
                    uVar151 = vcmpps_avx512vl(auVar127,auVar93,0);
                    local_4e4 = uVar72;
                    uVar70 = uVar72;
                    if ((bVar79 & (byte)uVar151) != 0) {
                      uVar70 = (uint)(bVar79 & (byte)uVar151);
                    }
                    uVar71 = 0;
                    for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
                      uVar71 = uVar71 + 1;
                    }
                    uVar69 = (ulong)uVar71;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar74->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_140 = vmovdqa64_avx512vl(auVar205._0_32_);
                      local_420 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_440 = local_280;
                      local_4a0._0_8_ = pGVar74;
                      do {
                        local_484 = local_200[uVar69];
                        local_480 = *(undefined4 *)(local_1e0 + uVar69 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar69 * 4);
                        local_518.context = context->user;
                        fVar138 = 1.0 - local_484;
                        fVar157 = fVar138 * fVar138 * -3.0;
                        auVar181 = ZEXT464((uint)fVar157);
                        auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138)),
                                                  ZEXT416((uint)(local_484 * fVar138)),
                                                  ZEXT416(0xc0000000));
                        auVar84 = vfmsub132ss_fma(ZEXT416((uint)(local_484 * fVar138)),
                                                  ZEXT416((uint)(local_484 * local_484)),
                                                  ZEXT416(0x40000000));
                        fVar138 = auVar83._0_4_ * 3.0;
                        fVar148 = auVar84._0_4_ * 3.0;
                        fVar149 = local_484 * local_484 * 3.0;
                        auVar184._0_4_ = fVar149 * (float)local_4d0._0_4_;
                        auVar184._4_4_ = fVar149 * (float)local_4d0._4_4_;
                        auVar184._8_4_ = fVar149 * (float)uStack_4c8;
                        auVar184._12_4_ = fVar149 * uStack_4c8._4_4_;
                        auVar186 = ZEXT1664(auVar184);
                        auVar162._4_4_ = fVar148;
                        auVar162._0_4_ = fVar148;
                        auVar162._8_4_ = fVar148;
                        auVar162._12_4_ = fVar148;
                        auVar83 = vfmadd132ps_fma(auVar162,auVar184,local_4c0);
                        auVar171._4_4_ = fVar138;
                        auVar171._0_4_ = fVar138;
                        auVar171._8_4_ = fVar138;
                        auVar171._12_4_ = fVar138;
                        auVar83 = vfmadd132ps_fma(auVar171,auVar83,local_4b0);
                        auVar163._4_4_ = fVar157;
                        auVar163._0_4_ = fVar157;
                        auVar163._8_4_ = fVar157;
                        auVar163._12_4_ = fVar157;
                        auVar83 = vfmadd213ps_fma(auVar163,auVar190._0_16_,auVar83);
                        local_490 = vmovlps_avx(auVar83);
                        local_488 = vextractps_avx(auVar83,2);
                        local_47c = uVar13;
                        local_478 = (int)local_550;
                        local_474 = (local_518.context)->instID[0];
                        local_470 = (local_518.context)->instPrimID[0];
                        local_554 = -1;
                        local_518.valid = &local_554;
                        local_518.geometryUserPtr = pGVar74->userPtr;
                        local_518.ray = (RTCRayN *)ray;
                        local_518.hit = (RTCHitN *)&local_490;
                        local_518.N = 1;
                        if (pGVar74->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019b0794:
                          p_Var15 = context->args->filter;
                          if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_4a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar181 = ZEXT1664(auVar181._0_16_);
                            auVar186 = ZEXT1664(auVar186._0_16_);
                            (*p_Var15)(&local_518);
                            auVar193 = ZEXT3264(local_440);
                            auVar190 = ZEXT1664(local_4e0);
                            ray = local_548;
                            context = local_540;
                            if (*local_518.valid == 0) goto LAB_019b0839;
                          }
                          (((Vec3f *)((long)local_518.ray + 0x30))->field_0).components[0] =
                               *(float *)local_518.hit;
                          (((Vec3f *)((long)local_518.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_518.hit + 4);
                          (((Vec3f *)((long)local_518.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_518.hit + 8);
                          *(float *)((long)local_518.ray + 0x3c) = *(float *)(local_518.hit + 0xc);
                          *(float *)((long)local_518.ray + 0x40) = *(float *)(local_518.hit + 0x10);
                          *(float *)((long)local_518.ray + 0x44) = *(float *)(local_518.hit + 0x14);
                          *(float *)((long)local_518.ray + 0x48) = *(float *)(local_518.hit + 0x18);
                          *(float *)((long)local_518.ray + 0x4c) = *(float *)(local_518.hit + 0x1c);
                          *(float *)((long)local_518.ray + 0x50) = *(float *)(local_518.hit + 0x20);
                        }
                        else {
                          auVar181 = ZEXT464((uint)fVar157);
                          auVar186 = ZEXT1664(auVar184);
                          (*pGVar74->intersectionFilterN)(&local_518);
                          auVar193 = ZEXT3264(local_440);
                          auVar190 = ZEXT1664(local_4e0);
                          ray = local_548;
                          context = local_540;
                          if (*local_518.valid != 0) goto LAB_019b0794;
LAB_019b0839:
                          (local_548->super_RayK<1>).tfar = (float)local_420._0_4_;
                          ray = local_548;
                          context = local_540;
                        }
                        bVar79 = ~(byte)(1 << ((uint)uVar69 & 0x1f)) & (byte)uVar72;
                        fVar157 = (ray->super_RayK<1>).tfar;
                        auVar32._4_4_ = fVar157;
                        auVar32._0_4_ = fVar157;
                        auVar32._8_4_ = fVar157;
                        auVar32._12_4_ = fVar157;
                        auVar32._16_4_ = fVar157;
                        auVar32._20_4_ = fVar157;
                        auVar32._24_4_ = fVar157;
                        auVar32._28_4_ = fVar157;
                        uVar151 = vcmpps_avx512vl(auVar193._0_32_,auVar32,2);
                        if ((bVar79 & (byte)uVar151) == 0) goto LAB_019b08dd;
                        local_420 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar79 = bVar79 & (byte)uVar151;
                        uVar72 = (uint)bVar79;
                        auVar146._8_4_ = 0x7f800000;
                        auVar146._0_8_ = 0x7f8000007f800000;
                        auVar146._12_4_ = 0x7f800000;
                        auVar146._16_4_ = 0x7f800000;
                        auVar146._20_4_ = 0x7f800000;
                        auVar146._24_4_ = 0x7f800000;
                        auVar146._28_4_ = 0x7f800000;
                        auVar93 = vblendmps_avx512vl(auVar146,auVar193._0_32_);
                        auVar128._0_4_ =
                             (uint)(bVar79 & 1) * auVar93._0_4_ |
                             (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                        bVar16 = (bool)(bVar79 >> 1 & 1);
                        auVar128._4_4_ = (uint)bVar16 * auVar93._4_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar79 >> 2 & 1);
                        auVar128._8_4_ = (uint)bVar16 * auVar93._8_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar79 >> 3 & 1);
                        auVar128._12_4_ = (uint)bVar16 * auVar93._12_4_ | (uint)!bVar16 * 0x7f800000
                        ;
                        bVar16 = (bool)(bVar79 >> 4 & 1);
                        auVar128._16_4_ = (uint)bVar16 * auVar93._16_4_ | (uint)!bVar16 * 0x7f800000
                        ;
                        bVar16 = (bool)(bVar79 >> 5 & 1);
                        auVar128._20_4_ = (uint)bVar16 * auVar93._20_4_ | (uint)!bVar16 * 0x7f800000
                        ;
                        bVar16 = (bool)(bVar79 >> 6 & 1);
                        auVar128._24_4_ = (uint)bVar16 * auVar93._24_4_ | (uint)!bVar16 * 0x7f800000
                        ;
                        auVar128._28_4_ =
                             (uint)(bVar79 >> 7) * auVar93._28_4_ |
                             (uint)!(bool)(bVar79 >> 7) * 0x7f800000;
                        auVar93 = vshufps_avx(auVar128,auVar128,0xb1);
                        auVar93 = vminps_avx(auVar128,auVar93);
                        auVar91 = vshufpd_avx(auVar93,auVar93,5);
                        auVar93 = vminps_avx(auVar93,auVar91);
                        auVar91 = vpermpd_avx2(auVar93,0x4e);
                        auVar93 = vminps_avx(auVar93,auVar91);
                        uVar151 = vcmpps_avx512vl(auVar128,auVar93,0);
                        bVar68 = (byte)uVar151 & bVar79;
                        if (bVar68 != 0) {
                          bVar79 = bVar68;
                        }
                        uVar70 = 0;
                        for (uVar71 = (uint)bVar79; (uVar71 & 1) == 0;
                            uVar71 = uVar71 >> 1 | 0x80000000) {
                          uVar70 = uVar70 + 1;
                        }
                        uVar69 = (ulong)uVar70;
                        pGVar74 = (Geometry *)local_4a0._0_8_;
                      } while( true );
                    }
                    fVar157 = local_200[uVar69];
                    fVar138 = *(float *)(local_1e0 + uVar69 * 4);
                    fVar149 = 1.0 - fVar157;
                    fVar148 = fVar149 * fVar149 * -3.0;
                    auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149)),
                                              ZEXT416((uint)(fVar157 * fVar149)),ZEXT416(0xc0000000)
                                             );
                    auVar84 = vfmsub132ss_fma(ZEXT416((uint)(fVar157 * fVar149)),
                                              ZEXT416((uint)(fVar157 * fVar157)),ZEXT416(0x40000000)
                                             );
                    fVar149 = auVar83._0_4_ * 3.0;
                    fVar150 = auVar84._0_4_ * 3.0;
                    fVar168 = fVar157 * fVar157 * 3.0;
                    auVar183._0_4_ = fVar168 * (float)local_4d0._0_4_;
                    auVar183._4_4_ = fVar168 * (float)local_4d0._4_4_;
                    auVar183._8_4_ = fVar168 * (float)uStack_4c8;
                    auVar183._12_4_ = fVar168 * uStack_4c8._4_4_;
                    auVar186 = ZEXT1664(auVar183);
                    auVar160._4_4_ = fVar150;
                    auVar160._0_4_ = fVar150;
                    auVar160._8_4_ = fVar150;
                    auVar160._12_4_ = fVar150;
                    auVar83 = vfmadd132ps_fma(auVar160,auVar183,local_4c0);
                    auVar170._4_4_ = fVar149;
                    auVar170._0_4_ = fVar149;
                    auVar170._8_4_ = fVar149;
                    auVar170._12_4_ = fVar149;
                    auVar83 = vfmadd132ps_fma(auVar170,auVar83,local_4b0);
                    auVar161._4_4_ = fVar148;
                    auVar161._0_4_ = fVar148;
                    auVar161._8_4_ = fVar148;
                    auVar161._12_4_ = fVar148;
                    auVar181 = ZEXT464((uint)*(float *)(local_1c0 + uVar69 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar69 * 4);
                    auVar83 = vfmadd213ps_fma(auVar161,local_4e0,auVar83);
                    uVar151 = vmovlps_avx(auVar83);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar151;
                    fVar148 = (float)vextractps_avx(auVar83,2);
                    (ray->Ng).field_0.field_0.z = fVar148;
                    ray->u = fVar157;
                    ray->v = fVar138;
                    ray->primID = uVar13;
                    ray->geomID = (uint)local_550;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_019b05f3;
      }
    }
    fVar157 = (ray->super_RayK<1>).tfar;
    auVar27._4_4_ = fVar157;
    auVar27._0_4_ = fVar157;
    auVar27._8_4_ = fVar157;
    auVar27._12_4_ = fVar157;
    auVar27._16_4_ = fVar157;
    auVar27._20_4_ = fVar157;
    auVar27._24_4_ = fVar157;
    auVar27._28_4_ = fVar157;
    uVar151 = vcmpps_avx512vl(local_80,auVar27,2);
    uVar75 = (ulong)((uint)uVar75 & (uint)uVar151);
  } while( true );
LAB_019b08dd:
  auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar206 = ZEXT3264(auVar93);
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar207 = ZEXT1664(auVar83);
  auVar208 = ZEXT464(0x35000000);
  auVar93 = vmovdqa64_avx512vl(local_140);
  auVar205 = ZEXT3264(auVar93);
  pre = local_538;
  prim = local_528;
  pPVar76 = local_530;
LAB_019b05f3:
  lVar78 = lVar78 + 8;
  goto LAB_019afd67;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }